

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conelinei_intersector.h
# Opt level: O1

void embree::avx512::ConeCurveMiIntersectorK<8,_16,_true>::intersect
               (Precalculations *pre,RayHitK<16> *ray,size_t k,RayQueryContext *context,
               Primitive *line)

{
  float fVar1;
  float fVar2;
  float fVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  Scene *pSVar10;
  Geometry *pGVar11;
  long lVar12;
  RTCFilterFunctionN p_Var13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  bool bVar22;
  bool bVar23;
  bool bVar24;
  bool bVar25;
  bool bVar26;
  bool bVar27;
  bool bVar28;
  bool bVar29;
  bool bVar30;
  bool bVar31;
  bool bVar32;
  bool bVar33;
  bool bVar34;
  bool bVar35;
  bool bVar36;
  bool bVar37;
  bool bVar38;
  bool bVar39;
  bool bVar40;
  bool bVar41;
  bool bVar42;
  bool bVar43;
  bool bVar44;
  bool bVar45;
  bool bVar46;
  bool bVar47;
  bool bVar48;
  bool bVar49;
  bool bVar50;
  bool bVar51;
  bool bVar52;
  float fVar53;
  float fVar54;
  float fVar55;
  float fVar56;
  float fVar57;
  float fVar58;
  float fVar59;
  float fVar60;
  float fVar61;
  float fVar62;
  float fVar63;
  float fVar64;
  float fVar65;
  float fVar66;
  float fVar67;
  float fVar68;
  float fVar69;
  float fVar70;
  undefined8 uVar71;
  undefined8 uVar72;
  undefined8 uVar73;
  undefined8 uVar74;
  ulong uVar75;
  ulong uVar76;
  byte bVar77;
  byte bVar78;
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  int iVar88;
  int iVar89;
  int iVar90;
  int iVar91;
  int iVar92;
  int iVar93;
  int iVar94;
  byte bVar95;
  byte bVar96;
  uint uVar97;
  uint uVar98;
  uint uVar99;
  byte bVar100;
  uint uVar101;
  ulong uVar102;
  ulong uVar103;
  ulong uVar104;
  undefined1 auVar106 [16];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [64];
  undefined1 auVar158 [64];
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  undefined1 auVar162 [64];
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  undefined1 auVar165 [64];
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  undefined1 auVar169 [64];
  float fVar172;
  undefined1 auVar170 [32];
  undefined1 auVar171 [64];
  float fVar173;
  float fVar176;
  float fVar177;
  float fVar178;
  float fVar179;
  float fVar180;
  float fVar181;
  undefined1 auVar175 [64];
  undefined1 auVar182 [32];
  undefined1 auVar183 [64];
  undefined1 auVar184 [32];
  undefined1 auVar185 [64];
  undefined1 auVar186 [64];
  undefined1 auVar187 [64];
  undefined1 auVar188 [64];
  undefined1 auVar189 [64];
  undefined1 auVar190 [64];
  undefined1 auVar191 [64];
  undefined1 auVar192 [64];
  undefined1 auVar193 [64];
  undefined1 auVar194 [64];
  undefined1 auVar195 [64];
  undefined1 auVar196 [64];
  undefined1 auVar197 [64];
  undefined1 auVar198 [64];
  undefined1 auVar199 [64];
  undefined1 auVar200 [64];
  undefined1 auVar201 [64];
  undefined1 auVar202 [64];
  undefined1 auVar203 [64];
  Scene *scene;
  RTCFilterFunctionNArguments args;
  RoundLineIntersectorHitM<8> hit;
  vint<16> mask;
  RTCFilterFunctionNArguments local_7f0;
  undefined1 local_7c0 [32];
  undefined1 local_7a0 [8];
  float fStack_798;
  float fStack_794;
  float fStack_790;
  float fStack_78c;
  float fStack_788;
  float fStack_784;
  uint local_780 [4];
  uint uStack_770;
  uint uStack_76c;
  uint uStack_768;
  uint uStack_764;
  undefined1 local_760 [32];
  undefined1 local_740 [32];
  uint local_720 [4];
  uint uStack_710;
  uint uStack_70c;
  uint uStack_708;
  uint uStack_704;
  uint local_700 [4];
  uint uStack_6f0;
  uint uStack_6ec;
  uint uStack_6e8;
  uint uStack_6e4;
  uint local_6e0 [4];
  uint uStack_6d0;
  uint uStack_6cc;
  uint uStack_6c8;
  uint uStack_6c4;
  undefined1 local_6c0 [64];
  undefined1 local_680 [8];
  float fStack_678;
  float fStack_674;
  float fStack_670;
  float fStack_66c;
  float fStack_668;
  float fStack_664;
  undefined1 auStack_660 [32];
  undefined1 local_640 [32];
  undefined1 local_620 [32];
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [32];
  undefined1 local_580 [32];
  undefined1 local_560 [32];
  undefined1 local_540 [32];
  undefined1 local_520 [32];
  undefined1 local_500 [32];
  undefined1 local_4e0 [32];
  int local_4c0;
  int iStack_4bc;
  int iStack_4b8;
  int iStack_4b4;
  int iStack_4b0;
  int iStack_4ac;
  int iStack_4a8;
  int iStack_4a4;
  undefined1 local_4a0 [32];
  undefined1 local_480 [32];
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  undefined1 local_400 [32];
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  undefined1 local_320 [8];
  float fStack_318;
  float fStack_314;
  float fStack_310;
  float fStack_30c;
  float fStack_308;
  float fStack_304;
  undefined1 local_300 [64];
  RTCHitN local_2c0 [64];
  undefined1 local_280 [64];
  undefined1 local_240 [64];
  undefined1 local_200 [64];
  undefined1 local_1c0 [64];
  undefined1 local_180 [64];
  undefined1 local_140 [64];
  undefined1 local_100 [64];
  undefined1 local_c0 [64];
  int iVar105;
  int iVar141;
  int iVar142;
  int iVar143;
  int iVar144;
  int iVar145;
  int iVar146;
  int iVar147;
  undefined1 auVar174 [32];
  
  pSVar10 = context->scene;
  pGVar11 = (pSVar10->geometries).items[line->sharedGeomID].ptr;
  uVar101 = (line->v0).field_0.i[0];
  lVar12 = *(long *)&pGVar11[1].time_range.upper;
  p_Var13 = pGVar11[1].intersectionFilterN;
  uVar98 = (line->v0).field_0.i[1];
  uVar97 = (line->v0).field_0.i[2];
  uVar99 = (line->v0).field_0.i[3];
  uVar6 = (line->v0).field_0.i[4];
  auVar111._16_16_ = *(undefined1 (*) [16])(lVar12 + (ulong)uVar6 * (long)p_Var13);
  auVar111._0_16_ = *(undefined1 (*) [16])(lVar12 + (ulong)uVar101 * (long)p_Var13);
  uVar7 = (line->v0).field_0.i[5];
  auVar138._16_16_ = *(undefined1 (*) [16])(lVar12 + (ulong)uVar7 * (long)p_Var13);
  auVar138._0_16_ = *(undefined1 (*) [16])(lVar12 + (ulong)uVar98 * (long)p_Var13);
  uVar8 = (line->v0).field_0.i[6];
  auVar120._16_16_ = *(undefined1 (*) [16])(lVar12 + (ulong)uVar8 * (long)p_Var13);
  auVar120._0_16_ = *(undefined1 (*) [16])(lVar12 + (ulong)uVar97 * (long)p_Var13);
  uVar9 = (line->v0).field_0.i[7];
  auVar116._16_16_ = *(undefined1 (*) [16])(lVar12 + (ulong)uVar9 * (long)p_Var13);
  auVar116._0_16_ = *(undefined1 (*) [16])(lVar12 + (ulong)uVar99 * (long)p_Var13);
  auVar106 = *(undefined1 (*) [16])(lVar12 + (ulong)(uVar6 + 1) * (long)p_Var13);
  auVar131._0_16_ =
       ZEXT116(0) * auVar106 +
       ZEXT116(1) * *(undefined1 (*) [16])(lVar12 + (ulong)(uVar101 + 1) * (long)p_Var13);
  auVar131._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar106;
  auVar106 = *(undefined1 (*) [16])(lVar12 + (ulong)(uVar7 + 1) * (long)p_Var13);
  auVar159._0_16_ =
       ZEXT116(0) * auVar106 +
       ZEXT116(1) * *(undefined1 (*) [16])(lVar12 + (ulong)(uVar98 + 1) * (long)p_Var13);
  auVar159._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar106;
  auVar106 = *(undefined1 (*) [16])(lVar12 + (ulong)(uVar8 + 1) * (long)p_Var13);
  auVar161._0_16_ =
       ZEXT116(0) * auVar106 +
       ZEXT116(1) * *(undefined1 (*) [16])(lVar12 + (ulong)(uVar97 + 1) * (long)p_Var13);
  auVar161._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar106;
  auVar106 = *(undefined1 (*) [16])(lVar12 + (ulong)(uVar9 + 1) * (long)p_Var13);
  auVar163._0_16_ =
       ZEXT116(0) * auVar106 +
       ZEXT116(1) * *(undefined1 (*) [16])(lVar12 + (ulong)(uVar99 + 1) * (long)p_Var13);
  auVar163._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar106;
  local_340 = vpbroadcastd_avx512vl();
  auVar112 = vunpcklps_avx(auVar111,auVar120);
  auVar110 = vunpckhps_avx(auVar111,auVar120);
  auVar120 = vunpcklps_avx(auVar138,auVar116);
  auVar111 = vunpckhps_avx(auVar138,auVar116);
  auVar116 = vunpcklps_avx(auVar112,auVar120);
  auVar120 = vunpckhps_avx(auVar112,auVar120);
  auVar117 = vunpcklps_avx(auVar110,auVar111);
  auVar138 = vunpckhps_avx(auVar110,auVar111);
  auVar112 = vpunpckldq_avx2(auVar131,auVar161);
  auVar110 = vpunpckhdq_avx2(auVar131,auVar161);
  auVar131 = vpunpckldq_avx2(auVar159,auVar163);
  auVar111 = vpunpckhdq_avx2(auVar159,auVar163);
  auVar161 = vpunpckldq_avx2(auVar112,auVar131);
  auVar131 = vpunpckhdq_avx2(auVar112,auVar131);
  auVar163 = vpunpckldq_avx2(auVar110,auVar111);
  auVar159 = vpunpckhdq_avx2(auVar110,auVar111);
  auVar110 = vpcmpeqd_avx2(auVar112,auVar112);
  uVar76 = vpcmpd_avx512vl(auVar110,(undefined1  [32])(line->primIDs).field_0,4);
  fVar1 = *(float *)(ray + k * 4);
  auVar114._4_4_ = fVar1;
  auVar114._0_4_ = fVar1;
  auVar114._8_4_ = fVar1;
  auVar114._12_4_ = fVar1;
  auVar114._16_4_ = fVar1;
  auVar114._20_4_ = fVar1;
  auVar114._24_4_ = fVar1;
  auVar114._28_4_ = fVar1;
  fVar2 = *(float *)(ray + k * 4 + 0x40);
  auVar115._4_4_ = fVar2;
  auVar115._0_4_ = fVar2;
  auVar115._8_4_ = fVar2;
  auVar115._12_4_ = fVar2;
  auVar115._16_4_ = fVar2;
  auVar115._20_4_ = fVar2;
  auVar115._24_4_ = fVar2;
  auVar115._28_4_ = fVar2;
  fVar3 = *(float *)(ray + k * 4 + 0x80);
  auVar118._4_4_ = fVar3;
  auVar118._0_4_ = fVar3;
  auVar118._8_4_ = fVar3;
  auVar118._12_4_ = fVar3;
  auVar118._16_4_ = fVar3;
  auVar118._20_4_ = fVar3;
  auVar118._24_4_ = fVar3;
  auVar118._28_4_ = fVar3;
  auVar107 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x100)));
  auVar194 = ZEXT3264(auVar107);
  auVar108 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x140)));
  auVar195 = ZEXT3264(auVar108);
  auVar109 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x180)));
  auVar196 = ZEXT3264(auVar109);
  auVar106 = vmulss_avx512f(auVar109._0_16_,auVar109._0_16_);
  auVar110 = vfmadd231ps_avx512vl(ZEXT1632(auVar106),auVar108,auVar108);
  auVar110 = vfmadd231ps_avx512vl(auVar110,auVar107,auVar107);
  auVar113._0_4_ = auVar110._0_4_;
  auVar113._4_4_ = auVar113._0_4_;
  auVar113._8_4_ = auVar113._0_4_;
  auVar113._12_4_ = auVar113._0_4_;
  auVar113._16_4_ = auVar113._0_4_;
  auVar113._20_4_ = auVar113._0_4_;
  auVar113._24_4_ = auVar113._0_4_;
  auVar113._28_4_ = auVar113._0_4_;
  auVar111 = vrcp14ps_avx512vl(auVar113);
  auVar110._8_4_ = 0x3f800000;
  auVar110._0_8_ = &DAT_3f8000003f800000;
  auVar110._12_4_ = 0x3f800000;
  auVar110._16_4_ = 0x3f800000;
  auVar110._20_4_ = 0x3f800000;
  auVar110._24_4_ = 0x3f800000;
  auVar110._28_4_ = 0x3f800000;
  auVar110 = vfnmadd213ps_avx512vl(auVar113,auVar111,auVar110);
  auVar106 = vfmadd132ps_fma(auVar110,auVar111,auVar111);
  auVar119._0_4_ = auVar116._0_4_ + auVar161._0_4_;
  auVar119._4_4_ = auVar116._4_4_ + auVar161._4_4_;
  auVar119._8_4_ = auVar116._8_4_ + auVar161._8_4_;
  auVar119._12_4_ = auVar116._12_4_ + auVar161._12_4_;
  auVar119._16_4_ = auVar116._16_4_ + auVar161._16_4_;
  auVar119._20_4_ = auVar116._20_4_ + auVar161._20_4_;
  auVar119._24_4_ = auVar116._24_4_ + auVar161._24_4_;
  auVar119._28_4_ = auVar116._28_4_ + auVar161._28_4_;
  auVar121._0_4_ = auVar131._0_4_ + auVar120._0_4_;
  auVar121._4_4_ = auVar131._4_4_ + auVar120._4_4_;
  auVar121._8_4_ = auVar131._8_4_ + auVar120._8_4_;
  auVar121._12_4_ = auVar131._12_4_ + auVar120._12_4_;
  auVar121._16_4_ = auVar131._16_4_ + auVar120._16_4_;
  auVar121._20_4_ = auVar131._20_4_ + auVar120._20_4_;
  auVar121._24_4_ = auVar131._24_4_ + auVar120._24_4_;
  auVar121._28_4_ = auVar131._28_4_ + auVar120._28_4_;
  auVar122._0_4_ = auVar117._0_4_ + auVar163._0_4_;
  auVar122._4_4_ = auVar117._4_4_ + auVar163._4_4_;
  auVar122._8_4_ = auVar117._8_4_ + auVar163._8_4_;
  auVar122._12_4_ = auVar117._12_4_ + auVar163._12_4_;
  auVar122._16_4_ = auVar117._16_4_ + auVar163._16_4_;
  auVar122._20_4_ = auVar117._20_4_ + auVar163._20_4_;
  auVar122._24_4_ = auVar117._24_4_ + auVar163._24_4_;
  auVar122._28_4_ = auVar117._28_4_ + auVar163._28_4_;
  auVar110 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
  auVar111 = vmulps_avx512vl(auVar119,auVar110);
  auVar112 = vmulps_avx512vl(auVar121,auVar110);
  auVar113 = vmulps_avx512vl(auVar122,auVar110);
  auVar110 = vsubps_avx(auVar111,auVar114);
  auVar111 = vsubps_avx(auVar112,auVar115);
  auVar112 = vsubps_avx(auVar113,auVar118);
  auVar112 = vmulps_avx512vl(auVar112,auVar109);
  auVar111 = vfmadd231ps_avx512vl(auVar112,auVar108,auVar111);
  auVar110 = vfmadd231ps_avx512vl(auVar111,auVar107,auVar110);
  auVar148._0_4_ = auVar110._0_4_ * auVar106._0_4_;
  auVar148._4_4_ = auVar110._4_4_ * auVar106._4_4_;
  auVar148._8_4_ = auVar110._8_4_ * auVar106._8_4_;
  auVar148._12_4_ = auVar110._12_4_ * auVar106._12_4_;
  auVar148._16_4_ = auVar110._16_4_ * 0.0;
  auVar148._20_4_ = auVar110._20_4_ * 0.0;
  auVar148._24_4_ = auVar110._24_4_ * 0.0;
  auVar148._28_4_ = 0;
  auVar110 = vmulps_avx512vl(auVar107,auVar148);
  auVar111 = vmulps_avx512vl(auVar108,auVar148);
  auVar112 = vmulps_avx512vl(auVar109,auVar148);
  auVar125._0_4_ = auVar110._0_4_ + fVar1;
  auVar125._4_4_ = auVar110._4_4_ + fVar1;
  auVar125._8_4_ = auVar110._8_4_ + fVar1;
  auVar125._12_4_ = auVar110._12_4_ + fVar1;
  auVar125._16_4_ = auVar110._16_4_ + fVar1;
  auVar125._20_4_ = auVar110._20_4_ + fVar1;
  auVar125._24_4_ = auVar110._24_4_ + fVar1;
  auVar125._28_4_ = auVar110._28_4_ + fVar1;
  auVar126._0_4_ = auVar111._0_4_ + fVar2;
  auVar126._4_4_ = auVar111._4_4_ + fVar2;
  auVar126._8_4_ = auVar111._8_4_ + fVar2;
  auVar126._12_4_ = auVar111._12_4_ + fVar2;
  auVar126._16_4_ = auVar111._16_4_ + fVar2;
  auVar126._20_4_ = auVar111._20_4_ + fVar2;
  auVar126._24_4_ = auVar111._24_4_ + fVar2;
  auVar126._28_4_ = auVar111._28_4_ + fVar2;
  auVar127._0_4_ = fVar3 + auVar112._0_4_;
  auVar127._4_4_ = fVar3 + auVar112._4_4_;
  auVar127._8_4_ = fVar3 + auVar112._8_4_;
  auVar127._12_4_ = fVar3 + auVar112._12_4_;
  auVar127._16_4_ = fVar3 + auVar112._16_4_;
  auVar127._20_4_ = fVar3 + auVar112._20_4_;
  auVar127._24_4_ = fVar3 + auVar112._24_4_;
  auVar127._28_4_ = fVar3 + auVar112._28_4_;
  auVar113 = vsubps_avx512vl(auVar161,auVar116);
  auVar199 = ZEXT3264(auVar113);
  auVar114 = vsubps_avx512vl(auVar131,auVar120);
  auVar197 = ZEXT3264(auVar114);
  auVar115 = vsubps_avx512vl(auVar163,auVar117);
  auVar198 = ZEXT3264(auVar115);
  auVar110 = vsubps_avx(auVar125,auVar116);
  _local_7a0 = vsubps_avx512vl(auVar126,auVar120);
  auVar116 = vsubps_avx512vl(auVar127,auVar117);
  auVar202 = ZEXT3264(auVar116);
  auVar111 = vmulps_avx512vl(auVar115,auVar115);
  auVar111 = vfmadd231ps_avx512vl(auVar111,auVar114,auVar114);
  auVar117 = vfmadd231ps_avx512vl(auVar111,auVar113,auVar113);
  auVar111 = vmulps_avx512vl(auVar115,auVar116);
  auVar111 = vfmadd231ps_avx512vl(auVar111,_local_7a0,auVar114);
  auVar118 = vfmadd231ps_avx512vl(auVar111,auVar110,auVar113);
  auVar111 = vmulps_avx512vl(auVar115,auVar109);
  auVar111 = vfmadd231ps_avx512vl(auVar111,auVar108,auVar114);
  auVar119 = vfmadd231ps_avx512vl(auVar111,auVar107,auVar113);
  auVar111 = vsubps_avx(auVar138,auVar159);
  fVar1 = auVar111._0_4_;
  fVar3 = auVar111._4_4_;
  fVar56 = auVar111._8_4_;
  fVar59 = auVar111._12_4_;
  fVar62 = auVar111._16_4_;
  fVar65 = auVar111._20_4_;
  fVar68 = auVar111._24_4_;
  auVar152._0_4_ = fVar1 * fVar1 + auVar117._0_4_;
  auVar152._4_4_ = fVar3 * fVar3 + auVar117._4_4_;
  auVar152._8_4_ = fVar56 * fVar56 + auVar117._8_4_;
  auVar152._12_4_ = fVar59 * fVar59 + auVar117._12_4_;
  auVar152._16_4_ = fVar62 * fVar62 + auVar117._16_4_;
  auVar152._20_4_ = fVar65 * fVar65 + auVar117._20_4_;
  auVar152._24_4_ = fVar68 * fVar68 + auVar117._24_4_;
  auVar152._28_4_ = auVar120._28_4_ + auVar117._28_4_;
  auVar112 = vmulps_avx512vl(auVar109,auVar116);
  auVar112 = vfmadd231ps_avx512vl(auVar112,auVar108,_local_7a0);
  auVar120 = vfmadd231ps_avx512vl(auVar112,auVar107,auVar110);
  auVar112 = vmulps_avx512vl(auVar116,auVar116);
  auVar112 = vfmadd231ps_avx512vl(auVar112,_local_7a0,_local_7a0);
  _local_680 = auVar110;
  auVar165 = _local_680;
  auVar121 = vfmadd231ps_avx512vl(auVar112,auVar110,auVar110);
  auVar122 = vmulps_avx512vl(auVar117,auVar117);
  auVar203 = ZEXT3264(auVar122);
  auVar123 = vmulps_avx512vl(auVar138,auVar117);
  fVar2 = auVar119._0_4_;
  fVar173 = fVar2 * fVar2;
  fVar54 = auVar119._4_4_;
  fVar176 = fVar54 * fVar54;
  auVar112._4_4_ = fVar176;
  auVar112._0_4_ = fVar173;
  fVar57 = auVar119._8_4_;
  fVar177 = fVar57 * fVar57;
  auVar112._8_4_ = fVar177;
  fVar60 = auVar119._12_4_;
  fVar178 = fVar60 * fVar60;
  auVar112._12_4_ = fVar178;
  fVar63 = auVar119._16_4_;
  fVar179 = fVar63 * fVar63;
  auVar112._16_4_ = fVar179;
  fVar66 = auVar119._20_4_;
  fVar180 = fVar66 * fVar66;
  auVar112._20_4_ = fVar180;
  fVar69 = auVar119._24_4_;
  fVar181 = fVar69 * fVar69;
  auVar112._24_4_ = fVar181;
  auVar112._28_4_ = auVar110._28_4_;
  auVar112 = vmulps_avx512vl(auVar152,auVar112);
  auVar112 = vsubps_avx512vl(auVar122,auVar112);
  auVar120 = vmulps_avx512vl(auVar122,auVar120);
  auVar124 = vmulps_avx512vl(auVar119,auVar118);
  auVar124 = vmulps_avx512vl(auVar152,auVar124);
  auVar120 = vsubps_avx512vl(auVar120,auVar124);
  auVar124 = vmulps_avx512vl(auVar111,auVar119);
  auVar124 = vmulps_avx512vl(auVar123,auVar124);
  auVar120 = vaddps_avx512vl(auVar124,auVar120);
  auVar121 = vmulps_avx512vl(auVar122,auVar121);
  auVar124 = vmulps_avx512vl(auVar118,auVar118);
  auVar124 = vmulps_avx512vl(auVar152,auVar124);
  auVar121 = vsubps_avx512vl(auVar121,auVar124);
  auVar111 = vaddps_avx512vl(auVar111,auVar111);
  auVar111 = vmulps_avx512vl(auVar111,auVar118);
  auVar111 = vsubps_avx512vl(auVar111,auVar123);
  auVar111 = vmulps_avx512vl(auVar123,auVar111);
  auVar111 = vaddps_avx512vl(auVar121,auVar111);
  auVar121 = vmulps_avx512vl(auVar120,auVar120);
  auVar111 = vmulps_avx512vl(auVar112,auVar111);
  auVar111 = vsubps_avx512vl(auVar121,auVar111);
  auVar121 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
  uVar104 = vcmpps_avx512vl(auVar111,auVar121,5);
  bVar96 = (byte)(uVar76 & uVar104);
  if (bVar96 != 0) {
    auVar161 = vsubps_avx(auVar125,auVar161);
    auVar131 = vsubps_avx(auVar126,auVar131);
    auVar163 = vsubps_avx(auVar127,auVar163);
    auVar125 = vsqrtps_avx512vl(auVar111);
    auVar126 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
    auVar111 = vrcp14ps_avx512vl(auVar112);
    auVar127 = vfnmadd213ps_avx512vl(auVar111,auVar112,auVar126);
    auVar123._8_4_ = 0x7fffffff;
    auVar123._0_8_ = 0x7fffffff7fffffff;
    auVar123._12_4_ = 0x7fffffff;
    auVar123._16_4_ = 0x7fffffff;
    auVar123._20_4_ = 0x7fffffff;
    auVar123._24_4_ = 0x7fffffff;
    auVar123._28_4_ = 0x7fffffff;
    vandps_avx512vl(auVar112,auVar123);
    auVar124._8_4_ = 0x219392ef;
    auVar124._0_8_ = 0x219392ef219392ef;
    auVar124._12_4_ = 0x219392ef;
    auVar124._16_4_ = 0x219392ef;
    auVar124._20_4_ = 0x219392ef;
    auVar124._24_4_ = 0x219392ef;
    auVar124._28_4_ = 0x219392ef;
    uVar102 = vcmpps_avx512vl(auVar127,auVar124,2);
    auVar112 = vfmadd132ps_avx512vl(auVar127,auVar111,auVar111);
    auVar160._8_4_ = 0x80000000;
    auVar160._0_8_ = 0x8000000080000000;
    auVar160._12_4_ = 0x80000000;
    auVar160._16_4_ = 0x80000000;
    auVar160._20_4_ = 0x80000000;
    auVar160._24_4_ = 0x80000000;
    auVar160._28_4_ = 0x80000000;
    auVar111 = vxorps_avx512vl(auVar120,auVar160);
    auVar111 = vsubps_avx(auVar111,auVar125);
    auVar111 = vmulps_avx512vl(auVar111,auVar112);
    auVar184._8_4_ = 0xff800000;
    auVar184._0_8_ = 0xff800000ff800000;
    auVar184._12_4_ = 0xff800000;
    auVar184._16_4_ = 0xff800000;
    auVar184._20_4_ = 0xff800000;
    auVar184._24_4_ = 0xff800000;
    auVar184._28_4_ = 0xff800000;
    bVar14 = (bool)((byte)uVar102 & 1);
    auVar128._0_4_ = (uint)bVar14 * -0x800000 | (uint)!bVar14 * auVar111._0_4_;
    bVar14 = (bool)((byte)(uVar102 >> 1) & 1);
    auVar128._4_4_ = (uint)bVar14 * -0x800000 | (uint)!bVar14 * auVar111._4_4_;
    bVar14 = (bool)((byte)(uVar102 >> 2) & 1);
    auVar128._8_4_ = (uint)bVar14 * -0x800000 | (uint)!bVar14 * auVar111._8_4_;
    bVar14 = (bool)((byte)(uVar102 >> 3) & 1);
    auVar128._12_4_ = (uint)bVar14 * -0x800000 | (uint)!bVar14 * auVar111._12_4_;
    bVar14 = (bool)((byte)(uVar102 >> 4) & 1);
    auVar128._16_4_ = (uint)bVar14 * -0x800000 | (uint)!bVar14 * auVar111._16_4_;
    bVar14 = (bool)((byte)(uVar102 >> 5) & 1);
    auVar128._20_4_ = (uint)bVar14 * -0x800000 | (uint)!bVar14 * auVar111._20_4_;
    bVar14 = (bool)((byte)(uVar102 >> 6) & 1);
    auVar128._24_4_ = (uint)bVar14 * -0x800000 | (uint)!bVar14 * auVar111._24_4_;
    bVar14 = SUB81(uVar102 >> 7,0);
    auVar128._28_4_ = (uint)bVar14 * -0x800000 | (uint)!bVar14 * auVar111._28_4_;
    auVar111 = vsubps_avx512vl(auVar125,auVar120);
    auVar123 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
    auVar193 = ZEXT3264(auVar123);
    auVar111 = vmulps_avx512vl(auVar111,auVar112);
    bVar14 = (bool)((byte)uVar102 & 1);
    iVar105 = auVar123._0_4_;
    auVar129._0_4_ = (uint)bVar14 * iVar105 | (uint)!bVar14 * auVar111._0_4_;
    bVar14 = (bool)((byte)(uVar102 >> 1) & 1);
    iVar141 = auVar123._4_4_;
    auVar129._4_4_ = (uint)bVar14 * iVar141 | (uint)!bVar14 * auVar111._4_4_;
    bVar14 = (bool)((byte)(uVar102 >> 2) & 1);
    iVar142 = auVar123._8_4_;
    auVar129._8_4_ = (uint)bVar14 * iVar142 | (uint)!bVar14 * auVar111._8_4_;
    bVar14 = (bool)((byte)(uVar102 >> 3) & 1);
    iVar143 = auVar123._12_4_;
    auVar129._12_4_ = (uint)bVar14 * iVar143 | (uint)!bVar14 * auVar111._12_4_;
    bVar14 = (bool)((byte)(uVar102 >> 4) & 1);
    iVar144 = auVar123._16_4_;
    auVar129._16_4_ = (uint)bVar14 * iVar144 | (uint)!bVar14 * auVar111._16_4_;
    bVar14 = (bool)((byte)(uVar102 >> 5) & 1);
    iVar145 = auVar123._20_4_;
    auVar129._20_4_ = (uint)bVar14 * iVar145 | (uint)!bVar14 * auVar111._20_4_;
    bVar14 = (bool)((byte)(uVar102 >> 6) & 1);
    iVar146 = auVar123._24_4_;
    auVar129._24_4_ = (uint)bVar14 * iVar146 | (uint)!bVar14 * auVar111._24_4_;
    bVar14 = SUB81(uVar102 >> 7,0);
    iVar147 = auVar123._28_4_;
    auVar129._28_4_ = (uint)bVar14 * iVar147 | (uint)!bVar14 * auVar111._28_4_;
    auVar111 = vmulps_avx512vl(auVar119,auVar128);
    auVar182._0_4_ = auVar118._0_4_ + auVar111._0_4_;
    auVar182._4_4_ = auVar118._4_4_ + auVar111._4_4_;
    auVar182._8_4_ = auVar118._8_4_ + auVar111._8_4_;
    auVar182._12_4_ = auVar118._12_4_ + auVar111._12_4_;
    auVar182._16_4_ = auVar118._16_4_ + auVar111._16_4_;
    auVar182._20_4_ = auVar118._20_4_ + auVar111._20_4_;
    auVar182._24_4_ = auVar118._24_4_ + auVar111._24_4_;
    fVar172 = auVar118._28_4_;
    auVar182._28_4_ = fVar172 + auVar111._28_4_;
    auVar111 = vmulps_avx512vl(auVar119,auVar129);
    auVar124 = vaddps_avx512vl(auVar118,auVar111);
    auVar201 = ZEXT3264(auVar124);
    uVar71 = vcmpps_avx512vl(auVar182,auVar117,1);
    uVar72 = vcmpps_avx512vl(auVar182,auVar121,6);
    uVar73 = vcmpps_avx512vl(auVar124,auVar117,1);
    uVar74 = vcmpps_avx512vl(auVar124,auVar121,6);
    local_680._0_4_ = auVar110._0_4_;
    local_680._4_4_ = auVar110._4_4_;
    fStack_678 = auVar110._8_4_;
    fStack_674 = auVar110._12_4_;
    fStack_670 = auVar110._16_4_;
    fStack_66c = auVar110._20_4_;
    fStack_668 = auVar110._24_4_;
    auVar175._0_4_ = fVar2 * (float)local_680._0_4_;
    auVar175._4_4_ = fVar54 * (float)local_680._4_4_;
    auVar175._8_4_ = fVar57 * fStack_678;
    auVar175._12_4_ = fVar60 * fStack_674;
    auVar175._16_4_ = fVar63 * fStack_670;
    auVar175._20_4_ = fVar66 * fStack_66c;
    auVar175._28_36_ = SUB4836((undefined1  [48])0x0,0xc);
    auVar175._24_4_ = fVar69 * fStack_668;
    auVar111 = vmulps_avx512vl(auVar119,_local_7a0);
    auVar112 = vmulps_avx512vl(auVar119,auVar116);
    auVar120 = vmulps_avx512vl(auVar107,auVar118);
    auVar120 = vsubps_avx512vl(auVar175._0_32_,auVar120);
    auVar121 = vmulps_avx512vl(auVar108,auVar118);
    auVar111 = vsubps_avx512vl(auVar111,auVar121);
    auVar121 = vmulps_avx512vl(auVar109,auVar118);
    auVar112 = vsubps_avx512vl(auVar112,auVar121);
    auVar112 = vmulps_avx512vl(auVar112,auVar112);
    auVar111 = vfmadd231ps_avx512vl(auVar112,auVar111,auVar111);
    auVar111 = vfmadd231ps_avx512vl(auVar111,auVar120,auVar120);
    fVar53 = auVar138._0_4_;
    fVar55 = auVar138._4_4_;
    fVar58 = auVar138._8_4_;
    fVar61 = auVar138._12_4_;
    fVar64 = auVar138._16_4_;
    fVar67 = auVar138._20_4_;
    fVar70 = auVar138._24_4_;
    auVar81._4_4_ = fVar55 * fVar55 * fVar176;
    auVar81._0_4_ = fVar53 * fVar53 * fVar173;
    auVar81._8_4_ = fVar58 * fVar58 * fVar177;
    auVar81._12_4_ = fVar61 * fVar61 * fVar178;
    auVar81._16_4_ = fVar64 * fVar64 * fVar179;
    auVar81._20_4_ = fVar67 * fVar67 * fVar180;
    auVar81._24_4_ = fVar70 * fVar70 * fVar181;
    auVar81._28_4_ = auVar120._28_4_;
    uVar102 = vcmpps_avx512vl(auVar111,auVar81,1);
    uVar102 = (bVar96 & ~(byte)line->leftExists) & uVar102;
    auVar111 = vrcp14ps_avx512vl(auVar119);
    auVar112 = vfnmadd213ps_avx512vl(auVar111,auVar119,auVar126);
    auVar121 = vfmadd132ps_avx512vl(auVar112,auVar111,auVar111);
    auVar166._0_8_ = auVar118._0_8_ ^ 0x8000000080000000;
    auVar166._8_4_ = -auVar118._8_4_;
    auVar166._12_4_ = -auVar118._12_4_;
    auVar166._16_4_ = -auVar118._16_4_;
    auVar166._20_4_ = -auVar118._20_4_;
    auVar166._24_4_ = -auVar118._24_4_;
    auVar166._28_4_ = -fVar172;
    auVar111 = vmulps_avx512vl(auVar121,auVar166);
    bVar14 = (bool)((byte)uVar102 & 1);
    auVar130._0_4_ = (uint)bVar14 * auVar111._0_4_ | (uint)!bVar14 * iVar105;
    bVar14 = (bool)((byte)(uVar102 >> 1) & 1);
    auVar130._4_4_ = (uint)bVar14 * auVar111._4_4_ | (uint)!bVar14 * iVar141;
    bVar14 = (bool)((byte)(uVar102 >> 2) & 1);
    auVar130._8_4_ = (uint)bVar14 * auVar111._8_4_ | (uint)!bVar14 * iVar142;
    bVar14 = (bool)((byte)(uVar102 >> 3) & 1);
    auVar130._12_4_ = (uint)bVar14 * auVar111._12_4_ | (uint)!bVar14 * iVar143;
    bVar14 = (bool)((byte)(uVar102 >> 4) & 1);
    auVar130._16_4_ = (uint)bVar14 * auVar111._16_4_ | (uint)!bVar14 * iVar144;
    bVar14 = (bool)((byte)(uVar102 >> 5) & 1);
    auVar130._20_4_ = (uint)bVar14 * auVar111._20_4_ | (uint)!bVar14 * iVar145;
    bVar14 = (bool)((byte)(uVar102 >> 6) & 1);
    auVar130._24_4_ = (uint)bVar14 * auVar111._24_4_ | (uint)!bVar14 * iVar146;
    bVar14 = SUB81(uVar102 >> 7,0);
    auVar130._28_4_ = (uint)bVar14 * auVar111._28_4_ | (uint)!bVar14 * iVar147;
    auVar192 = ZEXT3264(auVar130);
    auVar111 = vmulps_avx512vl(auVar115,auVar163);
    auVar111 = vfmadd231ps_avx512vl(auVar111,auVar131,auVar114);
    auVar118 = vfmadd231ps_avx512vl(auVar111,auVar161,auVar113);
    auVar82._4_4_ = auVar161._4_4_ * fVar54;
    auVar82._0_4_ = auVar161._0_4_ * fVar2;
    auVar82._8_4_ = auVar161._8_4_ * fVar57;
    auVar82._12_4_ = auVar161._12_4_ * fVar60;
    auVar82._16_4_ = auVar161._16_4_ * fVar63;
    auVar82._20_4_ = auVar161._20_4_ * fVar66;
    auVar82._24_4_ = auVar161._24_4_ * fVar69;
    auVar82._28_4_ = fVar172;
    auVar83._4_4_ = auVar131._4_4_ * fVar54;
    auVar83._0_4_ = auVar131._0_4_ * fVar2;
    auVar83._8_4_ = auVar131._8_4_ * fVar57;
    auVar83._12_4_ = auVar131._12_4_ * fVar60;
    auVar83._16_4_ = auVar131._16_4_ * fVar63;
    auVar83._20_4_ = auVar131._20_4_ * fVar66;
    auVar83._24_4_ = auVar131._24_4_ * fVar69;
    auVar83._28_4_ = auVar161._28_4_;
    auVar84._4_4_ = auVar163._4_4_ * fVar54;
    auVar84._0_4_ = auVar163._0_4_ * fVar2;
    auVar84._8_4_ = auVar163._8_4_ * fVar57;
    auVar84._12_4_ = auVar163._12_4_ * fVar60;
    auVar84._16_4_ = auVar163._16_4_ * fVar63;
    auVar84._20_4_ = auVar163._20_4_ * fVar66;
    auVar84._24_4_ = auVar163._24_4_ * fVar69;
    auVar84._28_4_ = auVar119._28_4_;
    auVar111 = vmulps_avx512vl(auVar107,auVar118);
    auVar111 = vsubps_avx(auVar82,auVar111);
    auVar112 = vmulps_avx512vl(auVar108,auVar118);
    auVar112 = vsubps_avx(auVar83,auVar112);
    auVar131 = vmulps_avx512vl(auVar109,auVar118);
    auVar120 = vsubps_avx(auVar84,auVar131);
    auVar85._4_4_ = auVar120._4_4_ * auVar120._4_4_;
    auVar85._0_4_ = auVar120._0_4_ * auVar120._0_4_;
    auVar85._8_4_ = auVar120._8_4_ * auVar120._8_4_;
    auVar85._12_4_ = auVar120._12_4_ * auVar120._12_4_;
    auVar85._16_4_ = auVar120._16_4_ * auVar120._16_4_;
    auVar85._20_4_ = auVar120._20_4_ * auVar120._20_4_;
    auVar85._24_4_ = auVar120._24_4_ * auVar120._24_4_;
    auVar85._28_4_ = auVar120._28_4_;
    auVar106 = vfmadd231ps_fma(auVar85,auVar112,auVar112);
    auVar106 = vfmadd231ps_fma(ZEXT1632(auVar106),auVar111,auVar111);
    auVar86._4_4_ = fVar176 * auVar159._4_4_ * auVar159._4_4_;
    auVar86._0_4_ = fVar173 * auVar159._0_4_ * auVar159._0_4_;
    auVar86._8_4_ = fVar177 * auVar159._8_4_ * auVar159._8_4_;
    auVar86._12_4_ = fVar178 * auVar159._12_4_ * auVar159._12_4_;
    auVar86._16_4_ = fVar179 * auVar159._16_4_ * auVar159._16_4_;
    auVar86._20_4_ = fVar180 * auVar159._20_4_ * auVar159._20_4_;
    auVar86._24_4_ = fVar181 * auVar159._24_4_ * auVar159._24_4_;
    auVar86._28_4_ = auVar159._28_4_;
    uVar4 = *(undefined4 *)(ray + k * 4 + 0xc0);
    auVar170._4_4_ = uVar4;
    auVar170._0_4_ = uVar4;
    auVar170._8_4_ = uVar4;
    auVar170._12_4_ = uVar4;
    auVar170._16_4_ = uVar4;
    auVar170._20_4_ = uVar4;
    auVar170._24_4_ = uVar4;
    auVar170._28_4_ = uVar4;
    bVar95 = (byte)uVar71 & (byte)uVar72 & bVar96;
    auVar111 = vblendmps_avx512vl(auVar123,auVar128);
    auVar132._0_4_ =
         (uint)(bVar95 & 1) * auVar111._0_4_ | (uint)!(bool)(bVar95 & 1) * auVar112._0_4_;
    bVar14 = (bool)(bVar95 >> 1 & 1);
    auVar132._4_4_ = (uint)bVar14 * auVar111._4_4_ | (uint)!bVar14 * auVar112._4_4_;
    bVar14 = (bool)(bVar95 >> 2 & 1);
    auVar132._8_4_ = (uint)bVar14 * auVar111._8_4_ | (uint)!bVar14 * auVar112._8_4_;
    bVar14 = (bool)(bVar95 >> 3 & 1);
    auVar132._12_4_ = (uint)bVar14 * auVar111._12_4_ | (uint)!bVar14 * auVar112._12_4_;
    bVar14 = (bool)(bVar95 >> 4 & 1);
    auVar132._16_4_ = (uint)bVar14 * auVar111._16_4_ | (uint)!bVar14 * auVar112._16_4_;
    bVar14 = (bool)(bVar95 >> 5 & 1);
    auVar132._20_4_ = (uint)bVar14 * auVar111._20_4_ | (uint)!bVar14 * auVar112._20_4_;
    bVar14 = (bool)(bVar95 >> 6 & 1);
    auVar132._24_4_ = (uint)bVar14 * auVar111._24_4_ | (uint)!bVar14 * auVar112._24_4_;
    auVar132._28_4_ =
         (uint)(bVar95 >> 7) * auVar111._28_4_ | (uint)!(bool)(bVar95 >> 7) * auVar112._28_4_;
    auVar186 = ZEXT3264(auVar132);
    bVar95 = (byte)uVar73 & (byte)uVar74 & bVar96;
    auVar111 = vblendmps_avx512vl(auVar184,auVar129);
    auVar133._0_4_ =
         (uint)(bVar95 & 1) * auVar111._0_4_ | (uint)!(bool)(bVar95 & 1) * auVar131._0_4_;
    bVar14 = (bool)(bVar95 >> 1 & 1);
    auVar133._4_4_ = (uint)bVar14 * auVar111._4_4_ | (uint)!bVar14 * auVar131._4_4_;
    bVar14 = (bool)(bVar95 >> 2 & 1);
    auVar133._8_4_ = (uint)bVar14 * auVar111._8_4_ | (uint)!bVar14 * auVar131._8_4_;
    bVar14 = (bool)(bVar95 >> 3 & 1);
    auVar133._12_4_ = (uint)bVar14 * auVar111._12_4_ | (uint)!bVar14 * auVar131._12_4_;
    bVar14 = (bool)(bVar95 >> 4 & 1);
    auVar133._16_4_ = (uint)bVar14 * auVar111._16_4_ | (uint)!bVar14 * auVar131._16_4_;
    bVar14 = (bool)(bVar95 >> 5 & 1);
    auVar133._20_4_ = (uint)bVar14 * auVar111._20_4_ | (uint)!bVar14 * auVar131._20_4_;
    bVar14 = (bool)(bVar95 >> 6 & 1);
    auVar133._24_4_ = (uint)bVar14 * auVar111._24_4_ | (uint)!bVar14 * auVar131._24_4_;
    auVar133._28_4_ =
         (uint)(bVar95 >> 7) * auVar111._28_4_ | (uint)!(bool)(bVar95 >> 7) * auVar131._28_4_;
    auVar187 = ZEXT3264(auVar133);
    auVar167._0_8_ = auVar118._0_8_ ^ 0x8000000080000000;
    auVar167._8_4_ = auVar118._8_4_ ^ 0x80000000;
    auVar167._12_4_ = auVar118._12_4_ ^ 0x80000000;
    auVar167._16_4_ = auVar118._16_4_ ^ 0x80000000;
    auVar167._20_4_ = auVar118._20_4_ ^ 0x80000000;
    auVar167._24_4_ = auVar118._24_4_ ^ 0x80000000;
    auVar167._28_4_ = auVar118._28_4_ ^ 0x80000000;
    uVar102 = vcmpps_avx512vl(ZEXT1632(auVar106),auVar86,1);
    uVar102 = (bVar96 & ~(byte)line->rightExists) & uVar102;
    auVar111 = vmulps_avx512vl(auVar121,auVar167);
    bVar14 = (bool)((byte)uVar102 & 1);
    auVar134._0_4_ = (uint)bVar14 * auVar111._0_4_ | (uint)!bVar14 * iVar105;
    bVar14 = (bool)((byte)(uVar102 >> 1) & 1);
    auVar134._4_4_ = (uint)bVar14 * auVar111._4_4_ | (uint)!bVar14 * iVar141;
    bVar14 = (bool)((byte)(uVar102 >> 2) & 1);
    auVar134._8_4_ = (uint)bVar14 * auVar111._8_4_ | (uint)!bVar14 * iVar142;
    bVar14 = (bool)((byte)(uVar102 >> 3) & 1);
    auVar134._12_4_ = (uint)bVar14 * auVar111._12_4_ | (uint)!bVar14 * iVar143;
    bVar14 = (bool)((byte)(uVar102 >> 4) & 1);
    auVar134._16_4_ = (uint)bVar14 * auVar111._16_4_ | (uint)!bVar14 * iVar144;
    bVar14 = (bool)((byte)(uVar102 >> 5) & 1);
    auVar134._20_4_ = (uint)bVar14 * auVar111._20_4_ | (uint)!bVar14 * iVar145;
    bVar14 = (bool)((byte)(uVar102 >> 6) & 1);
    auVar134._24_4_ = (uint)bVar14 * auVar111._24_4_ | (uint)!bVar14 * iVar146;
    bVar14 = SUB81(uVar102 >> 7,0);
    auVar134._28_4_ = (uint)bVar14 * auVar111._28_4_ | (uint)!bVar14 * iVar147;
    auVar111 = vminps_avx512vl(auVar130,auVar134);
    auVar120 = vmaxps_avx512vl(auVar130,auVar134);
    auVar112 = vminps_avx(auVar132,auVar111);
    uVar102 = vcmpps_avx512vl(auVar112,auVar111,0);
    uVar75 = vcmpps_avx512vl(auVar120,auVar123,0);
    bVar14 = (bool)((byte)uVar75 & 1);
    bVar17 = (bool)((byte)(uVar75 >> 1) & 1);
    bVar19 = (bool)((byte)(uVar75 >> 2) & 1);
    bVar21 = (bool)((byte)(uVar75 >> 3) & 1);
    bVar23 = (bool)((byte)(uVar75 >> 4) & 1);
    bVar30 = (bool)((byte)(uVar75 >> 5) & 1);
    bVar38 = (bool)((byte)(uVar75 >> 6) & 1);
    bVar47 = SUB81(uVar75 >> 7,0);
    uVar75 = vcmpps_avx512vl(auVar111,auVar123,0);
    bVar15 = (bool)((byte)uVar75 & 1);
    bVar18 = (bool)((byte)(uVar75 >> 1) & 1);
    bVar20 = (bool)((byte)(uVar75 >> 2) & 1);
    bVar22 = (bool)((byte)(uVar75 >> 3) & 1);
    bVar24 = (bool)((byte)(uVar75 >> 4) & 1);
    bVar31 = (bool)((byte)(uVar75 >> 5) & 1);
    bVar39 = (bool)((byte)(uVar75 >> 6) & 1);
    bVar48 = SUB81(uVar75 >> 7,0);
    bVar16 = (bool)((byte)uVar102 & 1);
    auVar135._0_4_ =
         (uint)bVar16 * ((uint)bVar14 * -0x800000 | (uint)!bVar14 * auVar120._0_4_) |
         (uint)!bVar16 * ((uint)bVar15 * -0x800000 | (uint)!bVar15 * auVar111._0_4_);
    bVar14 = (bool)((byte)(uVar102 >> 1) & 1);
    auVar135._4_4_ =
         (uint)bVar14 * ((uint)bVar17 * -0x800000 | (uint)!bVar17 * auVar120._4_4_) |
         (uint)!bVar14 * ((uint)bVar18 * -0x800000 | (uint)!bVar18 * auVar111._4_4_);
    bVar14 = (bool)((byte)(uVar102 >> 2) & 1);
    auVar135._8_4_ =
         (uint)bVar14 * ((uint)bVar19 * -0x800000 | (uint)!bVar19 * auVar120._8_4_) |
         (uint)!bVar14 * ((uint)bVar20 * -0x800000 | (uint)!bVar20 * auVar111._8_4_);
    bVar14 = (bool)((byte)(uVar102 >> 3) & 1);
    auVar135._12_4_ =
         (uint)bVar14 * ((uint)bVar21 * -0x800000 | (uint)!bVar21 * auVar120._12_4_) |
         (uint)!bVar14 * ((uint)bVar22 * -0x800000 | (uint)!bVar22 * auVar111._12_4_);
    bVar14 = (bool)((byte)(uVar102 >> 4) & 1);
    auVar135._16_4_ =
         (uint)bVar14 * ((uint)bVar23 * -0x800000 | (uint)!bVar23 * auVar120._16_4_) |
         (uint)!bVar14 * ((uint)bVar24 * -0x800000 | (uint)!bVar24 * auVar111._16_4_);
    bVar14 = (bool)((byte)(uVar102 >> 5) & 1);
    auVar135._20_4_ =
         (uint)bVar14 * ((uint)bVar30 * -0x800000 | (uint)!bVar30 * auVar120._20_4_) |
         (uint)!bVar14 * ((uint)bVar31 * -0x800000 | (uint)!bVar31 * auVar111._20_4_);
    bVar14 = (bool)((byte)(uVar102 >> 6) & 1);
    auVar135._24_4_ =
         (uint)bVar14 * ((uint)bVar38 * -0x800000 | (uint)!bVar38 * auVar120._24_4_) |
         (uint)!bVar14 * ((uint)bVar39 * -0x800000 | (uint)!bVar39 * auVar111._24_4_);
    bVar14 = SUB81(uVar102 >> 7,0);
    auVar135._28_4_ =
         (uint)bVar14 * ((uint)bVar47 * -0x800000 | (uint)!bVar47 * auVar120._28_4_) |
         (uint)!bVar14 * ((uint)bVar48 * -0x800000 | (uint)!bVar48 * auVar111._28_4_);
    auVar111 = vmaxps_avx(auVar133,auVar135);
    auVar188 = ZEXT3264(auVar111);
    auVar164._0_4_ = auVar148._0_4_ + auVar112._0_4_;
    auVar164._4_4_ = auVar148._4_4_ + auVar112._4_4_;
    auVar164._8_4_ = auVar148._8_4_ + auVar112._8_4_;
    auVar164._12_4_ = auVar148._12_4_ + auVar112._12_4_;
    auVar164._16_4_ = auVar148._16_4_ + auVar112._16_4_;
    auVar164._20_4_ = auVar148._20_4_ + auVar112._20_4_;
    auVar164._24_4_ = auVar148._24_4_ + auVar112._24_4_;
    auVar164._28_4_ = auVar112._28_4_ + 0.0;
    uVar102 = vcmpps_avx512vl(auVar170,auVar164,2);
    uVar4 = *(undefined4 *)(ray + k * 4 + 0x200);
    auVar168._4_4_ = uVar4;
    auVar168._0_4_ = uVar4;
    auVar168._8_4_ = uVar4;
    auVar168._12_4_ = uVar4;
    auVar168._16_4_ = uVar4;
    auVar168._20_4_ = uVar4;
    auVar168._24_4_ = uVar4;
    auVar168._28_4_ = uVar4;
    uVar75 = vcmpps_avx512vl(auVar164,auVar168,2);
    auVar174._0_4_ = auVar111._0_4_ + auVar148._0_4_;
    auVar174._4_4_ = auVar111._4_4_ + auVar148._4_4_;
    auVar174._8_4_ = auVar111._8_4_ + auVar148._8_4_;
    auVar174._12_4_ = auVar111._12_4_ + auVar148._12_4_;
    auVar174._16_4_ = auVar111._16_4_ + auVar148._16_4_;
    auVar174._20_4_ = auVar111._20_4_ + auVar148._20_4_;
    auVar174._24_4_ = auVar111._24_4_ + auVar148._24_4_;
    auVar174._28_4_ = auVar111._28_4_ + 0.0;
    auVar175 = ZEXT3264(auVar174);
    uVar71 = vcmpps_avx512vl(auVar170,auVar174,2);
    uVar72 = vcmpps_avx512vl(auVar174,auVar168,2);
    uVar73 = vcmpps_avx512vl(auVar111,auVar184,4);
    bVar100 = (byte)uVar71 & (byte)uVar72 & (byte)uVar73;
    uVar103 = vcmpps_avx512vl(auVar112,auVar123,4);
    uVar103 = uVar102 & uVar75 & uVar103;
    bVar95 = (byte)uVar103 & bVar96;
    bVar78 = bVar96 & ((byte)uVar103 | bVar100);
    uVar101 = (uint)bVar78;
    if (bVar78 != 0) {
      auVar111 = vblendmps_avx512vl(auVar111,auVar112);
      auVar136._0_4_ =
           (float)((uint)(bVar95 & 1) * auVar111._0_4_ |
                  (uint)!(bool)(bVar95 & 1) * (int)auVar164._0_4_);
      bVar14 = (bool)(bVar95 >> 1 & 1);
      auVar136._4_4_ = (float)((uint)bVar14 * auVar111._4_4_ | (uint)!bVar14 * (int)auVar164._4_4_);
      bVar14 = (bool)(bVar95 >> 2 & 1);
      auVar136._8_4_ = (float)((uint)bVar14 * auVar111._8_4_ | (uint)!bVar14 * (int)auVar164._8_4_);
      bVar14 = (bool)(bVar95 >> 3 & 1);
      auVar136._12_4_ =
           (float)((uint)bVar14 * auVar111._12_4_ | (uint)!bVar14 * (int)auVar164._12_4_);
      bVar14 = (bool)(bVar95 >> 4 & 1);
      auVar136._16_4_ =
           (float)((uint)bVar14 * auVar111._16_4_ | (uint)!bVar14 * (int)auVar164._16_4_);
      bVar14 = (bool)(bVar95 >> 5 & 1);
      auVar136._20_4_ =
           (float)((uint)bVar14 * auVar111._20_4_ | (uint)!bVar14 * (int)auVar164._20_4_);
      bVar14 = (bool)(bVar95 >> 6 & 1);
      auVar136._24_4_ =
           (float)((uint)bVar14 * auVar111._24_4_ | (uint)!bVar14 * (int)auVar164._24_4_);
      auVar136._28_4_ =
           (float)((uint)(bVar95 >> 7) * auVar111._28_4_ |
                  (uint)!(bool)(bVar95 >> 7) * (int)auVar164._28_4_);
      auVar111 = vblendmps_avx512vl(auVar124,auVar182);
      auVar137._0_4_ =
           (float)((uint)(bVar95 & 1) * auVar111._0_4_ | (uint)!(bool)(bVar95 & 1) * -0x800000);
      bVar14 = (bool)(bVar95 >> 1 & 1);
      auVar137._4_4_ = (float)((uint)bVar14 * auVar111._4_4_ | (uint)!bVar14 * -0x800000);
      bVar14 = (bool)(bVar95 >> 2 & 1);
      auVar137._8_4_ = (float)((uint)bVar14 * auVar111._8_4_ | (uint)!bVar14 * -0x800000);
      bVar14 = (bool)(bVar95 >> 3 & 1);
      auVar137._12_4_ = (float)((uint)bVar14 * auVar111._12_4_ | (uint)!bVar14 * -0x800000);
      bVar14 = (bool)(bVar95 >> 4 & 1);
      auVar137._16_4_ = (float)((uint)bVar14 * auVar111._16_4_ | (uint)!bVar14 * -0x800000);
      bVar14 = (bool)(bVar95 >> 5 & 1);
      auVar137._20_4_ = (float)((uint)bVar14 * auVar111._20_4_ | (uint)!bVar14 * -0x800000);
      bVar14 = (bool)(bVar95 >> 6 & 1);
      auVar137._24_4_ = (float)((uint)bVar14 * auVar111._24_4_ | (uint)!bVar14 * -0x800000);
      auVar137._28_4_ =
           (uint)(bVar95 >> 7) * auVar111._28_4_ | (uint)!(bool)(bVar95 >> 7) * -0x800000;
      auVar111 = vrcp14ps_avx512vl(auVar117);
      auVar112 = vfnmadd213ps_avx512vl(auVar111,auVar117,auVar126);
      auVar106 = vfmadd132ps_fma(auVar112,auVar111,auVar111);
      auVar183 = ZEXT1664(auVar106);
      auVar87._4_4_ = fVar55 * fVar3 * auVar117._4_4_;
      auVar87._0_4_ = fVar53 * fVar1 * auVar117._0_4_;
      auVar87._8_4_ = fVar58 * fVar56 * auVar117._8_4_;
      auVar87._12_4_ = fVar61 * fVar59 * auVar117._12_4_;
      auVar87._16_4_ = fVar64 * fVar62 * auVar117._16_4_;
      auVar87._20_4_ = fVar67 * fVar65 * auVar117._20_4_;
      auVar87._24_4_ = fVar70 * fVar68 * auVar117._24_4_;
      auVar87._28_4_ = auVar138._28_4_;
      _local_320 = vmulps_avx512vl(auVar113,auVar87);
      auVar112 = vmulps_avx512vl(auVar114,auVar87);
      auVar189 = ZEXT3264(auVar112);
      auVar120 = vmulps_avx512vl(auVar113,auVar152);
      auVar190 = ZEXT3264(auVar120);
      auVar138 = vmulps_avx512vl(auVar114,auVar152);
      auVar191 = ZEXT3264(auVar138);
      uVar71 = vcmpps_avx512vl(auVar136,auVar132,0);
      uVar72 = vcmpps_avx512vl(auVar136,auVar133,0);
      bVar77 = ((byte)uVar71 | (byte)uVar72) & bVar96;
      uVar102 = vcmpps_avx512vl(auVar136,auVar130,0);
      uVar102 = uVar76 & uVar104 & uVar102;
      auVar117 = vmulps_avx512vl(auVar107,auVar136);
      auVar154._0_4_ = auVar117._0_4_ + (float)local_680._0_4_;
      auVar154._4_4_ = auVar117._4_4_ + (float)local_680._4_4_;
      auVar154._8_4_ = auVar117._8_4_ + fStack_678;
      auVar154._12_4_ = auVar117._12_4_ + fStack_674;
      auVar154._16_4_ = auVar117._16_4_ + fStack_670;
      auVar154._20_4_ = auVar117._20_4_ + fStack_66c;
      auVar154._24_4_ = auVar117._24_4_ + fStack_668;
      auVar154._28_4_ = auVar117._28_4_ + auVar110._28_4_;
      auVar110 = vmulps_avx512vl(auVar122,auVar154);
      auVar155._0_4_ = local_320._0_4_ + auVar110._0_4_;
      auVar155._4_4_ = local_320._4_4_ + auVar110._4_4_;
      auVar155._8_4_ = local_320._8_4_ + auVar110._8_4_;
      auVar155._12_4_ = local_320._12_4_ + auVar110._12_4_;
      auVar155._16_4_ = local_320._16_4_ + auVar110._16_4_;
      auVar155._20_4_ = local_320._20_4_ + auVar110._20_4_;
      auVar155._24_4_ = local_320._24_4_ + auVar110._24_4_;
      auVar155._28_4_ = local_320._28_4_ + auVar110._28_4_;
      auVar110 = vmulps_avx512vl(auVar120,auVar137);
      auVar120 = vxorps_avx512vl(auVar113,auVar160);
      auVar200 = ZEXT3264(auVar120);
      auVar120 = vblendmps_avx512vl(auVar113,auVar120);
      bVar95 = (byte)uVar102;
      bVar14 = (bool)((byte)(uVar102 >> 1) & 1);
      bVar17 = (bool)((byte)(uVar102 >> 2) & 1);
      bVar20 = (bool)((byte)(uVar102 >> 3) & 1);
      bVar23 = (bool)((byte)(uVar102 >> 4) & 1);
      bVar31 = (bool)((byte)(uVar102 >> 5) & 1);
      bVar47 = (bool)((byte)(uVar102 >> 6) & 1);
      bVar49 = SUB81(uVar102 >> 7,0);
      auVar110 = vsubps_avx512vl(auVar155,auVar110);
      bVar15 = (bool)(bVar77 >> 1 & 1);
      bVar18 = (bool)(bVar77 >> 2 & 1);
      bVar21 = (bool)(bVar77 >> 3 & 1);
      bVar24 = (bool)(bVar77 >> 4 & 1);
      bVar38 = (bool)(bVar77 >> 5 & 1);
      bVar48 = (bool)(bVar77 >> 6 & 1);
      auVar117 = vmulps_avx512vl(auVar108,auVar136);
      auVar156._0_4_ = auVar117._0_4_ + (float)local_7a0._0_4_;
      auVar156._4_4_ = auVar117._4_4_ + (float)local_7a0._4_4_;
      auVar156._8_4_ = auVar117._8_4_ + fStack_798;
      auVar156._12_4_ = auVar117._12_4_ + fStack_794;
      auVar156._16_4_ = auVar117._16_4_ + fStack_790;
      auVar156._20_4_ = auVar117._20_4_ + fStack_78c;
      auVar156._24_4_ = auVar117._24_4_ + fStack_788;
      auVar156._28_4_ = auVar117._28_4_ + fStack_784;
      auVar117 = vmulps_avx512vl(auVar122,auVar156);
      auVar112 = vaddps_avx512vl(auVar112,auVar117);
      iVar141 = (uint)!(bool)(bVar95 & 1) * auVar126._0_4_;
      iVar105 = (uint)!(bool)((byte)(uVar102 >> 1) & 1) * auVar126._4_4_;
      iVar142 = (uint)!(bool)((byte)(uVar102 >> 2) & 1) * auVar126._8_4_;
      iVar143 = (uint)!(bool)((byte)(uVar102 >> 3) & 1) * auVar126._12_4_;
      iVar144 = (uint)!(bool)((byte)(uVar102 >> 4) & 1) * auVar126._16_4_;
      iVar145 = (uint)!(bool)((byte)(uVar102 >> 5) & 1) * auVar126._20_4_;
      iVar146 = (uint)!(bool)((byte)(uVar102 >> 6) & 1) * auVar126._24_4_;
      iVar147 = (uint)!SUB81(uVar102 >> 7,0) * auVar126._28_4_;
      auVar117 = vmulps_avx512vl(auVar137,ZEXT1632(auVar106));
      bVar16 = (bool)(bVar77 >> 1 & 1);
      bVar19 = (bool)(bVar77 >> 2 & 1);
      bVar22 = (bool)(bVar77 >> 3 & 1);
      bVar30 = (bool)(bVar77 >> 4 & 1);
      bVar39 = (bool)(bVar77 >> 5 & 1);
      bVar40 = (bool)(bVar77 >> 6 & 1);
      local_780[0] = (uint)(bVar77 & 1) * auVar117._0_4_ | (uint)!(bool)(bVar77 & 1) * iVar141;
      local_780[1] = (uint)bVar16 * auVar117._4_4_ | (uint)!bVar16 * iVar105;
      local_780[2] = (uint)bVar19 * auVar117._8_4_ | (uint)!bVar19 * iVar142;
      local_780[3] = (uint)bVar22 * auVar117._12_4_ | (uint)!bVar22 * iVar143;
      uStack_770 = (uint)bVar30 * auVar117._16_4_ | (uint)!bVar30 * iVar144;
      uStack_76c = (uint)bVar39 * auVar117._20_4_ | (uint)!bVar39 * iVar145;
      uStack_768 = (uint)bVar40 * auVar117._24_4_ | (uint)!bVar40 * iVar146;
      uStack_764 = (uint)(bVar77 >> 7) * auVar117._28_4_ | (uint)!(bool)(bVar77 >> 7) * iVar147;
      auVar138 = vmulps_avx512vl(auVar138,auVar137);
      local_760 = ZEXT432(0) << 0x20;
      auVar117 = vxorps_avx512vl(auVar114,auVar160);
      auVar171 = ZEXT3264(auVar117);
      local_740._0_4_ = auVar148._0_4_ + auVar136._0_4_;
      local_740._4_4_ = auVar148._4_4_ + auVar136._4_4_;
      local_740._8_4_ = auVar148._8_4_ + auVar136._8_4_;
      local_740._12_4_ = auVar148._12_4_ + auVar136._12_4_;
      local_740._16_4_ = auVar148._16_4_ + auVar136._16_4_;
      local_740._20_4_ = auVar148._20_4_ + auVar136._20_4_;
      local_740._24_4_ = auVar148._24_4_ + auVar136._24_4_;
      local_740._28_4_ = auVar136._28_4_ + 0.0;
      auVar158 = ZEXT3264(local_740);
      local_720[0] = (uint)(bVar77 & 1) * auVar110._0_4_ |
                     (uint)!(bool)(bVar77 & 1) *
                     ((uint)(bVar95 & 1) * auVar120._0_4_ |
                     (uint)!(bool)(bVar95 & 1) * auVar111._0_4_);
      local_720[1] = (uint)bVar15 * auVar110._4_4_ |
                     (uint)!bVar15 *
                     ((uint)bVar14 * auVar120._4_4_ | (uint)!bVar14 * auVar111._4_4_);
      local_720[2] = (uint)bVar18 * auVar110._8_4_ |
                     (uint)!bVar18 *
                     ((uint)bVar17 * auVar120._8_4_ | (uint)!bVar17 * auVar111._8_4_);
      local_720[3] = (uint)bVar21 * auVar110._12_4_ |
                     (uint)!bVar21 *
                     ((uint)bVar20 * auVar120._12_4_ | (uint)!bVar20 * auVar111._12_4_);
      uStack_710 = (uint)bVar24 * auVar110._16_4_ |
                   (uint)!bVar24 *
                   ((uint)bVar23 * auVar120._16_4_ | (uint)!bVar23 * auVar111._16_4_);
      uStack_70c = (uint)bVar38 * auVar110._20_4_ |
                   (uint)!bVar38 *
                   ((uint)bVar31 * auVar120._20_4_ | (uint)!bVar31 * auVar111._20_4_);
      uStack_708 = (uint)bVar48 * auVar110._24_4_ |
                   (uint)!bVar48 *
                   ((uint)bVar47 * auVar120._24_4_ | (uint)!bVar47 * auVar111._24_4_);
      uStack_704 = (uint)(bVar77 >> 7) * auVar110._28_4_ |
                   (uint)!(bool)(bVar77 >> 7) *
                   ((uint)bVar49 * auVar120._28_4_ | (uint)!bVar49 * auVar111._28_4_);
      auVar110 = vblendmps_avx512vl(auVar114,auVar117);
      bVar14 = (bool)((byte)(uVar102 >> 1) & 1);
      bVar16 = (bool)((byte)(uVar102 >> 2) & 1);
      bVar17 = (bool)((byte)(uVar102 >> 3) & 1);
      bVar18 = (bool)((byte)(uVar102 >> 4) & 1);
      bVar19 = (bool)((byte)(uVar102 >> 5) & 1);
      bVar20 = (bool)((byte)(uVar102 >> 6) & 1);
      auVar111 = vsubps_avx512vl(auVar112,auVar138);
      local_700[0] = (uint)(bVar77 & 1) * auVar111._0_4_ |
                     (uint)!(bool)(bVar77 & 1) *
                     ((uint)(bVar95 & 1) * auVar110._0_4_ |
                     (uint)!(bool)(bVar95 & 1) * (int)auVar148._0_4_);
      bVar15 = (bool)(bVar77 >> 1 & 1);
      local_700[1] = (uint)bVar15 * auVar111._4_4_ |
                     (uint)!bVar15 *
                     ((uint)bVar14 * auVar110._4_4_ | (uint)!bVar14 * (int)auVar148._4_4_);
      bVar14 = (bool)(bVar77 >> 2 & 1);
      local_700[2] = (uint)bVar14 * auVar111._8_4_ |
                     (uint)!bVar14 *
                     ((uint)bVar16 * auVar110._8_4_ | (uint)!bVar16 * (int)auVar148._8_4_);
      bVar14 = (bool)(bVar77 >> 3 & 1);
      local_700[3] = (uint)bVar14 * auVar111._12_4_ |
                     (uint)!bVar14 *
                     ((uint)bVar17 * auVar110._12_4_ | (uint)!bVar17 * (int)auVar148._12_4_);
      bVar14 = (bool)(bVar77 >> 4 & 1);
      uStack_6f0 = (uint)bVar14 * auVar111._16_4_ |
                   (uint)!bVar14 *
                   ((uint)bVar18 * auVar110._16_4_ | (uint)!bVar18 * (int)auVar148._16_4_);
      bVar14 = (bool)(bVar77 >> 5 & 1);
      uStack_6ec = (uint)bVar14 * auVar111._20_4_ |
                   (uint)!bVar14 *
                   ((uint)bVar19 * auVar110._20_4_ | (uint)!bVar19 * (int)auVar148._20_4_);
      bVar14 = (bool)(bVar77 >> 6 & 1);
      uStack_6e8 = (uint)bVar14 * auVar111._24_4_ |
                   (uint)!bVar14 *
                   ((uint)bVar20 * auVar110._24_4_ | (uint)!bVar20 * (int)auVar148._24_4_);
      uStack_6e4 = (uint)(bVar77 >> 7) * auVar111._28_4_ |
                   (uint)!(bool)(bVar77 >> 7) * (uint)(byte)(uVar102 >> 7) * auVar110._28_4_;
      auVar110 = vmulps_avx512vl(auVar115,auVar87);
      auVar157 = ZEXT3264(auVar110);
      auVar111 = vmulps_avx512vl(auVar115,auVar152);
      auVar169 = ZEXT3264(auVar111);
      auVar112 = vmulps_avx512vl(auVar109,auVar136);
      auVar112 = vaddps_avx512vl(auVar116,auVar112);
      auVar112 = vmulps_avx512vl(auVar122,auVar112);
      auVar108._0_4_ = auVar110._0_4_ + auVar112._0_4_;
      auVar108._4_4_ = auVar110._4_4_ + auVar112._4_4_;
      auVar108._8_4_ = auVar110._8_4_ + auVar112._8_4_;
      auVar108._12_4_ = auVar110._12_4_ + auVar112._12_4_;
      auVar108._16_4_ = auVar110._16_4_ + auVar112._16_4_;
      auVar108._20_4_ = auVar110._20_4_ + auVar112._20_4_;
      auVar108._24_4_ = auVar110._24_4_ + auVar112._24_4_;
      auVar108._28_4_ = auVar110._28_4_ + auVar112._28_4_;
      auVar117._4_4_ = auVar111._4_4_ * auVar137._4_4_;
      auVar117._0_4_ = auVar111._0_4_ * auVar137._0_4_;
      auVar117._8_4_ = auVar111._8_4_ * auVar137._8_4_;
      auVar117._12_4_ = auVar111._12_4_ * auVar137._12_4_;
      auVar117._16_4_ = auVar111._16_4_ * auVar137._16_4_;
      auVar117._20_4_ = auVar111._20_4_ * auVar137._20_4_;
      auVar117._24_4_ = auVar111._24_4_ * auVar137._24_4_;
      auVar117._28_4_ = auVar152._28_4_;
      auVar110 = vxorps_avx512vl(auVar115,auVar160);
      auVar162 = ZEXT3264(auVar110);
      auVar110 = vblendmps_avx512vl(auVar115,auVar110);
      bVar14 = (bool)((byte)(uVar102 >> 1) & 1);
      bVar16 = (bool)((byte)(uVar102 >> 2) & 1);
      bVar17 = (bool)((byte)(uVar102 >> 3) & 1);
      bVar18 = (bool)((byte)(uVar102 >> 4) & 1);
      bVar19 = (bool)((byte)(uVar102 >> 5) & 1);
      bVar20 = (bool)((byte)(uVar102 >> 6) & 1);
      bVar21 = SUB81(uVar102 >> 7,0);
      auVar111 = vsubps_avx512vl(auVar108,auVar117);
      local_6e0[0] = (uint)(bVar77 & 1) * auVar111._0_4_ |
                     (uint)!(bool)(bVar77 & 1) *
                     ((uint)(bVar95 & 1) * auVar110._0_4_ | !(bool)(bVar95 & 1) * local_700[0]);
      bVar15 = (bool)(bVar77 >> 1 & 1);
      local_6e0[1] = (uint)bVar15 * auVar111._4_4_ |
                     (uint)!bVar15 * ((uint)bVar14 * auVar110._4_4_ | !bVar14 * local_700[1]);
      bVar14 = (bool)(bVar77 >> 2 & 1);
      local_6e0[2] = (uint)bVar14 * auVar111._8_4_ |
                     (uint)!bVar14 * ((uint)bVar16 * auVar110._8_4_ | !bVar16 * local_700[2]);
      bVar14 = (bool)(bVar77 >> 3 & 1);
      local_6e0[3] = (uint)bVar14 * auVar111._12_4_ |
                     (uint)!bVar14 * ((uint)bVar17 * auVar110._12_4_ | !bVar17 * local_700[3]);
      bVar14 = (bool)(bVar77 >> 4 & 1);
      uStack_6d0 = (uint)bVar14 * auVar111._16_4_ |
                   (uint)!bVar14 * ((uint)bVar18 * auVar110._16_4_ | !bVar18 * uStack_6f0);
      bVar14 = (bool)(bVar77 >> 5 & 1);
      uStack_6cc = (uint)bVar14 * auVar111._20_4_ |
                   (uint)!bVar14 * ((uint)bVar19 * auVar110._20_4_ | !bVar19 * uStack_6ec);
      bVar14 = (bool)(bVar77 >> 6 & 1);
      uStack_6c8 = (uint)bVar14 * auVar111._24_4_ |
                   (uint)!bVar14 * ((uint)bVar20 * auVar110._24_4_ | !bVar20 * uStack_6e8);
      uStack_6c4 = (uint)(bVar77 >> 7) * auVar111._28_4_ |
                   (uint)!(bool)(bVar77 >> 7) *
                   ((uint)bVar21 * auVar110._28_4_ | !bVar21 * uStack_6e4);
      auVar110 = vblendmps_avx512vl(auVar123,local_740);
      auVar107._0_4_ = (uint)(bVar78 & 1) * auVar110._0_4_ | !(bool)(bVar78 & 1) * local_6e0[0];
      bVar14 = (bool)(bVar78 >> 1 & 1);
      auVar107._4_4_ = (uint)bVar14 * auVar110._4_4_ | !bVar14 * local_6e0[1];
      bVar14 = (bool)(bVar78 >> 2 & 1);
      auVar107._8_4_ = (uint)bVar14 * auVar110._8_4_ | !bVar14 * local_6e0[2];
      bVar14 = (bool)(bVar78 >> 3 & 1);
      auVar107._12_4_ = (uint)bVar14 * auVar110._12_4_ | !bVar14 * local_6e0[3];
      bVar14 = (bool)(bVar78 >> 4 & 1);
      auVar107._16_4_ = (uint)bVar14 * auVar110._16_4_ | !bVar14 * uStack_6d0;
      bVar14 = (bool)(bVar78 >> 5 & 1);
      auVar107._20_4_ = (uint)bVar14 * auVar110._20_4_ | !bVar14 * uStack_6cc;
      bVar14 = (bool)(bVar78 >> 6 & 1);
      auVar107._24_4_ = (uint)bVar14 * auVar110._24_4_ | !bVar14 * uStack_6c8;
      auVar107._28_4_ = (uint)(bVar78 >> 7) * auVar110._28_4_ | !(bool)(bVar78 >> 7) * uStack_6c4;
      auVar110 = vshufps_avx(auVar107,auVar107,0xb1);
      auVar110 = vminps_avx(auVar107,auVar110);
      auVar111 = vshufpd_avx(auVar110,auVar110,5);
      auVar110 = vminps_avx(auVar110,auVar111);
      auVar111 = vpermpd_avx2(auVar110,0x4e);
      auVar110 = vminps_avx(auVar110,auVar111);
      uVar71 = vcmpps_avx512vl(auVar107,auVar110,0);
      uVar98 = uVar101;
      if (((byte)uVar71 & bVar78) != 0) {
        uVar98 = (uint)((byte)uVar71 & bVar78);
      }
      uVar97 = 0;
      for (; (uVar98 & 1) == 0; uVar98 = uVar98 >> 1 | 0x80000000) {
        uVar97 = uVar97 + 1;
      }
      auVar185 = vpmovm2d_avx512dq((ulong)(uint)(1 << ((uint)k & 0x1f)));
      _local_680 = auVar165;
LAB_01cee06b:
      local_7f0.valid = (int *)local_6c0;
      uVar99 = uVar97 & 0xff;
      uVar98 = *(uint *)(local_340 + (ulong)uVar99 * 4);
      pGVar11 = (pSVar10->geometries).items[uVar98].ptr;
      auVar110 = auVar107;
      local_7f0.ray = (RTCRayN *)ray;
      if ((pGVar11->mask & *(uint *)(ray + k * 4 + 0x240)) == 0) {
        uVar101 = (uint)(byte)(~(byte)(1 << (uVar97 & 0x1f)) & (byte)uVar101);
LAB_01cee0ba:
        bVar14 = true;
      }
      else {
        if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
           (pGVar11->intersectionFilterN != (RTCFilterFunctionN)0x0)) {
          local_3a0 = auVar158._0_32_;
          local_380 = auVar157._0_32_;
          local_360 = auVar162._0_32_;
          uVar104 = (ulong)(uVar99 * 4);
          local_200 = vbroadcastss_avx512f(ZEXT416(*(uint *)((long)local_780 + uVar104)));
          local_1c0 = vbroadcastss_avx512f(ZEXT416(*(uint *)(local_760 + uVar104)));
          auVar157 = vpbroadcastd_avx512f();
          local_180 = vbroadcastss_avx512f
                                (ZEXT416(*(uint *)((long)&(line->primIDs).field_0 + uVar104)));
          auVar158 = vpbroadcastd_avx512f(ZEXT416(*(uint *)((long)local_720 + uVar104)));
          local_280 = vbroadcastss_avx512f(ZEXT416(*(uint *)((long)local_700 + uVar104)));
          local_240 = vbroadcastss_avx512f(ZEXT416(*(uint *)((long)local_6e0 + uVar104)));
          auVar165 = vmovdqa64_avx512f(auVar158);
          local_2c0[0] = (RTCHitN)auVar165[0];
          local_2c0[1] = (RTCHitN)auVar165[1];
          local_2c0[2] = (RTCHitN)auVar165[2];
          local_2c0[3] = (RTCHitN)auVar165[3];
          local_2c0[4] = (RTCHitN)auVar165[4];
          local_2c0[5] = (RTCHitN)auVar165[5];
          local_2c0[6] = (RTCHitN)auVar165[6];
          local_2c0[7] = (RTCHitN)auVar165[7];
          local_2c0[8] = (RTCHitN)auVar165[8];
          local_2c0[9] = (RTCHitN)auVar165[9];
          local_2c0[10] = (RTCHitN)auVar165[10];
          local_2c0[0xb] = (RTCHitN)auVar165[0xb];
          local_2c0[0xc] = (RTCHitN)auVar165[0xc];
          local_2c0[0xd] = (RTCHitN)auVar165[0xd];
          local_2c0[0xe] = (RTCHitN)auVar165[0xe];
          local_2c0[0xf] = (RTCHitN)auVar165[0xf];
          local_2c0[0x10] = (RTCHitN)auVar165[0x10];
          local_2c0[0x11] = (RTCHitN)auVar165[0x11];
          local_2c0[0x12] = (RTCHitN)auVar165[0x12];
          local_2c0[0x13] = (RTCHitN)auVar165[0x13];
          local_2c0[0x14] = (RTCHitN)auVar165[0x14];
          local_2c0[0x15] = (RTCHitN)auVar165[0x15];
          local_2c0[0x16] = (RTCHitN)auVar165[0x16];
          local_2c0[0x17] = (RTCHitN)auVar165[0x17];
          local_2c0[0x18] = (RTCHitN)auVar165[0x18];
          local_2c0[0x19] = (RTCHitN)auVar165[0x19];
          local_2c0[0x1a] = (RTCHitN)auVar165[0x1a];
          local_2c0[0x1b] = (RTCHitN)auVar165[0x1b];
          local_2c0[0x1c] = (RTCHitN)auVar165[0x1c];
          local_2c0[0x1d] = (RTCHitN)auVar165[0x1d];
          local_2c0[0x1e] = (RTCHitN)auVar165[0x1e];
          local_2c0[0x1f] = (RTCHitN)auVar165[0x1f];
          local_2c0[0x20] = (RTCHitN)auVar165[0x20];
          local_2c0[0x21] = (RTCHitN)auVar165[0x21];
          local_2c0[0x22] = (RTCHitN)auVar165[0x22];
          local_2c0[0x23] = (RTCHitN)auVar165[0x23];
          local_2c0[0x24] = (RTCHitN)auVar165[0x24];
          local_2c0[0x25] = (RTCHitN)auVar165[0x25];
          local_2c0[0x26] = (RTCHitN)auVar165[0x26];
          local_2c0[0x27] = (RTCHitN)auVar165[0x27];
          local_2c0[0x28] = (RTCHitN)auVar165[0x28];
          local_2c0[0x29] = (RTCHitN)auVar165[0x29];
          local_2c0[0x2a] = (RTCHitN)auVar165[0x2a];
          local_2c0[0x2b] = (RTCHitN)auVar165[0x2b];
          local_2c0[0x2c] = (RTCHitN)auVar165[0x2c];
          local_2c0[0x2d] = (RTCHitN)auVar165[0x2d];
          local_2c0[0x2e] = (RTCHitN)auVar165[0x2e];
          local_2c0[0x2f] = (RTCHitN)auVar165[0x2f];
          local_2c0[0x30] = (RTCHitN)auVar165[0x30];
          local_2c0[0x31] = (RTCHitN)auVar165[0x31];
          local_2c0[0x32] = (RTCHitN)auVar165[0x32];
          local_2c0[0x33] = (RTCHitN)auVar165[0x33];
          local_2c0[0x34] = (RTCHitN)auVar165[0x34];
          local_2c0[0x35] = (RTCHitN)auVar165[0x35];
          local_2c0[0x36] = (RTCHitN)auVar165[0x36];
          local_2c0[0x37] = (RTCHitN)auVar165[0x37];
          local_2c0[0x38] = (RTCHitN)auVar165[0x38];
          local_2c0[0x39] = (RTCHitN)auVar165[0x39];
          local_2c0[0x3a] = (RTCHitN)auVar165[0x3a];
          local_2c0[0x3b] = (RTCHitN)auVar165[0x3b];
          local_2c0[0x3c] = (RTCHitN)auVar165[0x3c];
          local_2c0[0x3d] = (RTCHitN)auVar165[0x3d];
          local_2c0[0x3e] = (RTCHitN)auVar165[0x3e];
          local_2c0[0x3f] = (RTCHitN)auVar165[0x3f];
          vpcmpeqd_avx2(auVar158._0_32_,auVar158._0_32_);
          local_140 = vmovdqa64_avx512f(auVar157);
          local_100 = vbroadcastss_avx512f(ZEXT416(context->user->instID[0]));
          local_c0 = vbroadcastss_avx512f(ZEXT416(context->user->instPrimID[0]));
          uVar6 = *(uint *)(ray + k * 4 + 0x200);
          *(undefined4 *)(ray + k * 4 + 0x200) = *(undefined4 *)(local_740 + uVar104);
          local_6c0 = vmovdqa64_avx512f(auVar185);
          local_7f0.geometryUserPtr = pGVar11->userPtr;
          local_7f0.context = context->user;
          local_7f0.hit = local_2c0;
          local_7f0.N = 0x10;
          local_7c0 = auVar175._0_32_;
          local_3c0 = auVar194._0_32_;
          local_3e0 = auVar195._0_32_;
          local_400 = auVar196._0_32_;
          local_420 = auVar197._0_32_;
          local_440 = auVar198._0_32_;
          local_460 = auVar199._0_32_;
          local_480 = auVar202._0_32_;
          local_4a0 = auVar203._0_32_;
          local_4c0 = iVar141;
          iStack_4bc = iVar105;
          iStack_4b8 = iVar142;
          iStack_4b4 = iVar143;
          iStack_4b0 = iVar144;
          iStack_4ac = iVar145;
          iStack_4a8 = iVar146;
          iStack_4a4 = iVar147;
          local_4e0 = auVar201._0_32_;
          local_500 = auVar192._0_32_;
          local_520 = auVar186._0_32_;
          local_540 = auVar187._0_32_;
          local_560 = auVar183._0_32_;
          local_580 = auVar188._0_32_;
          local_5a0 = auVar189._0_32_;
          local_5c0 = auVar190._0_32_;
          local_5e0 = auVar191._0_32_;
          local_600 = auVar200._0_32_;
          local_620 = auVar171._0_32_;
          local_640 = auVar169._0_32_;
          local_300 = vmovdqa64_avx512f(auVar185);
          uVar104 = uVar103;
          if (pGVar11->intersectionFilterN != (RTCFilterFunctionN)0x0) {
            (*pGVar11->intersectionFilterN)(&local_7f0);
            auVar185 = vmovdqa64_avx512f(local_300);
            auVar169 = ZEXT3264(local_640);
            auVar171 = ZEXT3264(local_620);
            auVar200 = ZEXT3264(local_600);
            uVar104 = uVar103 & 0xffff;
            auVar191 = ZEXT3264(local_5e0);
            auVar190 = ZEXT3264(local_5c0);
            auVar189 = ZEXT3264(local_5a0);
            auVar188 = ZEXT3264(local_580);
            auVar183 = ZEXT3264(local_560);
            auVar187 = ZEXT3264(local_540);
            auVar186 = ZEXT3264(local_520);
            auVar192 = ZEXT3264(local_500);
            auVar201 = ZEXT3264(local_4e0);
            auVar203 = ZEXT3264(local_4a0);
            auVar202 = ZEXT3264(local_480);
            auVar199 = ZEXT3264(local_460);
            auVar198 = ZEXT3264(local_440);
            auVar197 = ZEXT3264(local_420);
            auVar196 = ZEXT3264(local_400);
            auVar195 = ZEXT3264(local_3e0);
            auVar194 = ZEXT3264(local_3c0);
            auVar175 = ZEXT3264(local_7c0);
            auVar110 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
            auVar193 = ZEXT3264(auVar110);
          }
          auVar165 = vmovdqa64_avx512f(local_6c0);
          uVar71 = vptestmd_avx512f(auVar165,auVar165);
          auVar162 = ZEXT3264(local_360);
          auVar157 = ZEXT3264(local_380);
          auVar158 = ZEXT3264(local_3a0);
          if ((short)uVar71 == 0) {
LAB_01cee64f:
            auVar110 = ZEXT432(uVar6);
            *(uint *)(ray + k * 4 + 0x200) = uVar6;
          }
          else {
            p_Var13 = context->args->filter;
            if ((p_Var13 != (RTCFilterFunctionN)0x0) &&
               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                 RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar11->field_8).field_0x2 & 0x40) != 0)))) {
              (*p_Var13)(&local_7f0);
              auVar185 = vmovdqa64_avx512f(local_300);
              auVar158 = ZEXT3264(local_3a0);
              auVar157 = ZEXT3264(local_380);
              auVar162 = ZEXT3264(local_360);
              auVar169 = ZEXT3264(local_640);
              auVar171 = ZEXT3264(local_620);
              auVar200 = ZEXT3264(local_600);
              uVar104 = uVar103 & 0xffff;
              auVar191 = ZEXT3264(local_5e0);
              auVar190 = ZEXT3264(local_5c0);
              auVar189 = ZEXT3264(local_5a0);
              auVar188 = ZEXT3264(local_580);
              auVar183 = ZEXT3264(local_560);
              auVar187 = ZEXT3264(local_540);
              auVar186 = ZEXT3264(local_520);
              auVar192 = ZEXT3264(local_500);
              auVar201 = ZEXT3264(local_4e0);
              auVar203 = ZEXT3264(local_4a0);
              auVar202 = ZEXT3264(local_480);
              auVar199 = ZEXT3264(local_460);
              auVar198 = ZEXT3264(local_440);
              auVar197 = ZEXT3264(local_420);
              auVar196 = ZEXT3264(local_400);
              auVar195 = ZEXT3264(local_3e0);
              auVar194 = ZEXT3264(local_3c0);
              auVar175 = ZEXT3264(local_7c0);
              auVar110 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
              auVar193 = ZEXT3264(auVar110);
            }
            auVar165 = vmovdqa64_avx512f(local_6c0);
            uVar76 = vptestmd_avx512f(auVar165,auVar165);
            if ((short)uVar76 == 0) goto LAB_01cee64f;
            iVar105 = *(int *)(local_7f0.hit + 4);
            iVar141 = *(int *)(local_7f0.hit + 8);
            iVar142 = *(int *)(local_7f0.hit + 0xc);
            iVar143 = *(int *)(local_7f0.hit + 0x10);
            iVar144 = *(int *)(local_7f0.hit + 0x14);
            iVar145 = *(int *)(local_7f0.hit + 0x18);
            iVar146 = *(int *)(local_7f0.hit + 0x1c);
            iVar147 = *(int *)(local_7f0.hit + 0x20);
            iVar88 = *(int *)(local_7f0.hit + 0x24);
            iVar89 = *(int *)(local_7f0.hit + 0x28);
            iVar90 = *(int *)(local_7f0.hit + 0x2c);
            iVar91 = *(int *)(local_7f0.hit + 0x30);
            iVar92 = *(int *)(local_7f0.hit + 0x34);
            iVar93 = *(int *)(local_7f0.hit + 0x38);
            iVar94 = *(int *)(local_7f0.hit + 0x3c);
            bVar95 = (byte)uVar76;
            bVar14 = (bool)((byte)(uVar76 >> 1) & 1);
            bVar15 = (bool)((byte)(uVar76 >> 2) & 1);
            bVar16 = (bool)((byte)(uVar76 >> 3) & 1);
            bVar17 = (bool)((byte)(uVar76 >> 4) & 1);
            bVar18 = (bool)((byte)(uVar76 >> 5) & 1);
            bVar19 = (bool)((byte)(uVar76 >> 6) & 1);
            bVar20 = (bool)((byte)(uVar76 >> 7) & 1);
            bVar78 = (byte)(uVar76 >> 8);
            bVar21 = (bool)((byte)(uVar76 >> 9) & 1);
            bVar22 = (bool)((byte)(uVar76 >> 10) & 1);
            bVar23 = (bool)((byte)(uVar76 >> 0xb) & 1);
            bVar24 = (bool)((byte)(uVar76 >> 0xc) & 1);
            bVar30 = (bool)((byte)(uVar76 >> 0xd) & 1);
            bVar31 = (bool)((byte)(uVar76 >> 0xe) & 1);
            bVar38 = SUB81(uVar76 >> 0xf,0);
            *(uint *)(local_7f0.ray + 0x300) =
                 (uint)(bVar95 & 1) * *(int *)local_7f0.hit |
                 (uint)!(bool)(bVar95 & 1) * *(int *)(local_7f0.ray + 0x300);
            *(uint *)(local_7f0.ray + 0x304) =
                 (uint)bVar14 * iVar105 | (uint)!bVar14 * *(int *)(local_7f0.ray + 0x304);
            *(uint *)(local_7f0.ray + 0x308) =
                 (uint)bVar15 * iVar141 | (uint)!bVar15 * *(int *)(local_7f0.ray + 0x308);
            *(uint *)(local_7f0.ray + 0x30c) =
                 (uint)bVar16 * iVar142 | (uint)!bVar16 * *(int *)(local_7f0.ray + 0x30c);
            *(uint *)(local_7f0.ray + 0x310) =
                 (uint)bVar17 * iVar143 | (uint)!bVar17 * *(int *)(local_7f0.ray + 0x310);
            *(uint *)(local_7f0.ray + 0x314) =
                 (uint)bVar18 * iVar144 | (uint)!bVar18 * *(int *)(local_7f0.ray + 0x314);
            *(uint *)(local_7f0.ray + 0x318) =
                 (uint)bVar19 * iVar145 | (uint)!bVar19 * *(int *)(local_7f0.ray + 0x318);
            *(uint *)(local_7f0.ray + 0x31c) =
                 (uint)bVar20 * iVar146 | (uint)!bVar20 * *(int *)(local_7f0.ray + 0x31c);
            *(uint *)(local_7f0.ray + 800) =
                 (uint)(bVar78 & 1) * iVar147 |
                 (uint)!(bool)(bVar78 & 1) * *(int *)(local_7f0.ray + 800);
            *(uint *)(local_7f0.ray + 0x324) =
                 (uint)bVar21 * iVar88 | (uint)!bVar21 * *(int *)(local_7f0.ray + 0x324);
            *(uint *)(local_7f0.ray + 0x328) =
                 (uint)bVar22 * iVar89 | (uint)!bVar22 * *(int *)(local_7f0.ray + 0x328);
            *(uint *)(local_7f0.ray + 0x32c) =
                 (uint)bVar23 * iVar90 | (uint)!bVar23 * *(int *)(local_7f0.ray + 0x32c);
            *(uint *)(local_7f0.ray + 0x330) =
                 (uint)bVar24 * iVar91 | (uint)!bVar24 * *(int *)(local_7f0.ray + 0x330);
            *(uint *)(local_7f0.ray + 0x334) =
                 (uint)bVar30 * iVar92 | (uint)!bVar30 * *(int *)(local_7f0.ray + 0x334);
            *(uint *)(local_7f0.ray + 0x338) =
                 (uint)bVar31 * iVar93 | (uint)!bVar31 * *(int *)(local_7f0.ray + 0x338);
            *(uint *)(local_7f0.ray + 0x33c) =
                 (uint)bVar38 * iVar94 | (uint)!bVar38 * *(int *)(local_7f0.ray + 0x33c);
            iVar105 = *(int *)(local_7f0.hit + 0x44);
            iVar141 = *(int *)(local_7f0.hit + 0x48);
            iVar142 = *(int *)(local_7f0.hit + 0x4c);
            iVar143 = *(int *)(local_7f0.hit + 0x50);
            iVar144 = *(int *)(local_7f0.hit + 0x54);
            iVar145 = *(int *)(local_7f0.hit + 0x58);
            iVar146 = *(int *)(local_7f0.hit + 0x5c);
            iVar147 = *(int *)(local_7f0.hit + 0x60);
            iVar88 = *(int *)(local_7f0.hit + 100);
            iVar89 = *(int *)(local_7f0.hit + 0x68);
            iVar90 = *(int *)(local_7f0.hit + 0x6c);
            iVar91 = *(int *)(local_7f0.hit + 0x70);
            iVar92 = *(int *)(local_7f0.hit + 0x74);
            iVar93 = *(int *)(local_7f0.hit + 0x78);
            iVar94 = *(int *)(local_7f0.hit + 0x7c);
            bVar14 = (bool)((byte)(uVar76 >> 1) & 1);
            bVar15 = (bool)((byte)(uVar76 >> 2) & 1);
            bVar16 = (bool)((byte)(uVar76 >> 3) & 1);
            bVar17 = (bool)((byte)(uVar76 >> 4) & 1);
            bVar18 = (bool)((byte)(uVar76 >> 5) & 1);
            bVar19 = (bool)((byte)(uVar76 >> 6) & 1);
            bVar20 = (bool)((byte)(uVar76 >> 7) & 1);
            bVar21 = (bool)((byte)(uVar76 >> 9) & 1);
            bVar22 = (bool)((byte)(uVar76 >> 10) & 1);
            bVar23 = (bool)((byte)(uVar76 >> 0xb) & 1);
            bVar24 = (bool)((byte)(uVar76 >> 0xc) & 1);
            bVar30 = (bool)((byte)(uVar76 >> 0xd) & 1);
            bVar31 = (bool)((byte)(uVar76 >> 0xe) & 1);
            bVar38 = SUB81(uVar76 >> 0xf,0);
            *(uint *)(local_7f0.ray + 0x340) =
                 (uint)(bVar95 & 1) * *(int *)(local_7f0.hit + 0x40) |
                 (uint)!(bool)(bVar95 & 1) * *(int *)(local_7f0.ray + 0x340);
            *(uint *)(local_7f0.ray + 0x344) =
                 (uint)bVar14 * iVar105 | (uint)!bVar14 * *(int *)(local_7f0.ray + 0x344);
            *(uint *)(local_7f0.ray + 0x348) =
                 (uint)bVar15 * iVar141 | (uint)!bVar15 * *(int *)(local_7f0.ray + 0x348);
            *(uint *)(local_7f0.ray + 0x34c) =
                 (uint)bVar16 * iVar142 | (uint)!bVar16 * *(int *)(local_7f0.ray + 0x34c);
            *(uint *)(local_7f0.ray + 0x350) =
                 (uint)bVar17 * iVar143 | (uint)!bVar17 * *(int *)(local_7f0.ray + 0x350);
            *(uint *)(local_7f0.ray + 0x354) =
                 (uint)bVar18 * iVar144 | (uint)!bVar18 * *(int *)(local_7f0.ray + 0x354);
            *(uint *)(local_7f0.ray + 0x358) =
                 (uint)bVar19 * iVar145 | (uint)!bVar19 * *(int *)(local_7f0.ray + 0x358);
            *(uint *)(local_7f0.ray + 0x35c) =
                 (uint)bVar20 * iVar146 | (uint)!bVar20 * *(int *)(local_7f0.ray + 0x35c);
            *(uint *)(local_7f0.ray + 0x360) =
                 (uint)(bVar78 & 1) * iVar147 |
                 (uint)!(bool)(bVar78 & 1) * *(int *)(local_7f0.ray + 0x360);
            *(uint *)(local_7f0.ray + 0x364) =
                 (uint)bVar21 * iVar88 | (uint)!bVar21 * *(int *)(local_7f0.ray + 0x364);
            *(uint *)(local_7f0.ray + 0x368) =
                 (uint)bVar22 * iVar89 | (uint)!bVar22 * *(int *)(local_7f0.ray + 0x368);
            *(uint *)(local_7f0.ray + 0x36c) =
                 (uint)bVar23 * iVar90 | (uint)!bVar23 * *(int *)(local_7f0.ray + 0x36c);
            *(uint *)(local_7f0.ray + 0x370) =
                 (uint)bVar24 * iVar91 | (uint)!bVar24 * *(int *)(local_7f0.ray + 0x370);
            *(uint *)(local_7f0.ray + 0x374) =
                 (uint)bVar30 * iVar92 | (uint)!bVar30 * *(int *)(local_7f0.ray + 0x374);
            *(uint *)(local_7f0.ray + 0x378) =
                 (uint)bVar31 * iVar93 | (uint)!bVar31 * *(int *)(local_7f0.ray + 0x378);
            *(uint *)(local_7f0.ray + 0x37c) =
                 (uint)bVar38 * iVar94 | (uint)!bVar38 * *(int *)(local_7f0.ray + 0x37c);
            iVar105 = *(int *)(local_7f0.hit + 0x84);
            iVar141 = *(int *)(local_7f0.hit + 0x88);
            iVar142 = *(int *)(local_7f0.hit + 0x8c);
            iVar143 = *(int *)(local_7f0.hit + 0x90);
            iVar144 = *(int *)(local_7f0.hit + 0x94);
            iVar145 = *(int *)(local_7f0.hit + 0x98);
            iVar146 = *(int *)(local_7f0.hit + 0x9c);
            iVar147 = *(int *)(local_7f0.hit + 0xa0);
            iVar88 = *(int *)(local_7f0.hit + 0xa4);
            iVar89 = *(int *)(local_7f0.hit + 0xa8);
            iVar90 = *(int *)(local_7f0.hit + 0xac);
            iVar91 = *(int *)(local_7f0.hit + 0xb0);
            iVar92 = *(int *)(local_7f0.hit + 0xb4);
            iVar93 = *(int *)(local_7f0.hit + 0xb8);
            iVar94 = *(int *)(local_7f0.hit + 0xbc);
            bVar14 = (bool)((byte)(uVar76 >> 1) & 1);
            bVar15 = (bool)((byte)(uVar76 >> 2) & 1);
            bVar16 = (bool)((byte)(uVar76 >> 3) & 1);
            bVar17 = (bool)((byte)(uVar76 >> 4) & 1);
            bVar18 = (bool)((byte)(uVar76 >> 5) & 1);
            bVar19 = (bool)((byte)(uVar76 >> 6) & 1);
            bVar20 = (bool)((byte)(uVar76 >> 7) & 1);
            bVar21 = (bool)((byte)(uVar76 >> 9) & 1);
            bVar22 = (bool)((byte)(uVar76 >> 10) & 1);
            bVar23 = (bool)((byte)(uVar76 >> 0xb) & 1);
            bVar24 = (bool)((byte)(uVar76 >> 0xc) & 1);
            bVar30 = (bool)((byte)(uVar76 >> 0xd) & 1);
            bVar31 = (bool)((byte)(uVar76 >> 0xe) & 1);
            bVar38 = SUB81(uVar76 >> 0xf,0);
            *(uint *)(local_7f0.ray + 0x380) =
                 (uint)(bVar95 & 1) * *(int *)(local_7f0.hit + 0x80) |
                 (uint)!(bool)(bVar95 & 1) * *(int *)(local_7f0.ray + 0x380);
            *(uint *)(local_7f0.ray + 900) =
                 (uint)bVar14 * iVar105 | (uint)!bVar14 * *(int *)(local_7f0.ray + 900);
            *(uint *)(local_7f0.ray + 0x388) =
                 (uint)bVar15 * iVar141 | (uint)!bVar15 * *(int *)(local_7f0.ray + 0x388);
            *(uint *)(local_7f0.ray + 0x38c) =
                 (uint)bVar16 * iVar142 | (uint)!bVar16 * *(int *)(local_7f0.ray + 0x38c);
            *(uint *)(local_7f0.ray + 0x390) =
                 (uint)bVar17 * iVar143 | (uint)!bVar17 * *(int *)(local_7f0.ray + 0x390);
            *(uint *)(local_7f0.ray + 0x394) =
                 (uint)bVar18 * iVar144 | (uint)!bVar18 * *(int *)(local_7f0.ray + 0x394);
            *(uint *)(local_7f0.ray + 0x398) =
                 (uint)bVar19 * iVar145 | (uint)!bVar19 * *(int *)(local_7f0.ray + 0x398);
            *(uint *)(local_7f0.ray + 0x39c) =
                 (uint)bVar20 * iVar146 | (uint)!bVar20 * *(int *)(local_7f0.ray + 0x39c);
            *(uint *)(local_7f0.ray + 0x3a0) =
                 (uint)(bVar78 & 1) * iVar147 |
                 (uint)!(bool)(bVar78 & 1) * *(int *)(local_7f0.ray + 0x3a0);
            *(uint *)(local_7f0.ray + 0x3a4) =
                 (uint)bVar21 * iVar88 | (uint)!bVar21 * *(int *)(local_7f0.ray + 0x3a4);
            *(uint *)(local_7f0.ray + 0x3a8) =
                 (uint)bVar22 * iVar89 | (uint)!bVar22 * *(int *)(local_7f0.ray + 0x3a8);
            *(uint *)(local_7f0.ray + 0x3ac) =
                 (uint)bVar23 * iVar90 | (uint)!bVar23 * *(int *)(local_7f0.ray + 0x3ac);
            *(uint *)(local_7f0.ray + 0x3b0) =
                 (uint)bVar24 * iVar91 | (uint)!bVar24 * *(int *)(local_7f0.ray + 0x3b0);
            *(uint *)(local_7f0.ray + 0x3b4) =
                 (uint)bVar30 * iVar92 | (uint)!bVar30 * *(int *)(local_7f0.ray + 0x3b4);
            *(uint *)(local_7f0.ray + 0x3b8) =
                 (uint)bVar31 * iVar93 | (uint)!bVar31 * *(int *)(local_7f0.ray + 0x3b8);
            *(uint *)(local_7f0.ray + 0x3bc) =
                 (uint)bVar38 * iVar94 | (uint)!bVar38 * *(int *)(local_7f0.ray + 0x3bc);
            iVar105 = *(int *)(local_7f0.hit + 0xc4);
            iVar141 = *(int *)(local_7f0.hit + 200);
            iVar142 = *(int *)(local_7f0.hit + 0xcc);
            iVar143 = *(int *)(local_7f0.hit + 0xd0);
            iVar144 = *(int *)(local_7f0.hit + 0xd4);
            iVar145 = *(int *)(local_7f0.hit + 0xd8);
            iVar146 = *(int *)(local_7f0.hit + 0xdc);
            iVar147 = *(int *)(local_7f0.hit + 0xe0);
            iVar88 = *(int *)(local_7f0.hit + 0xe4);
            iVar89 = *(int *)(local_7f0.hit + 0xe8);
            iVar90 = *(int *)(local_7f0.hit + 0xec);
            iVar91 = *(int *)(local_7f0.hit + 0xf0);
            iVar92 = *(int *)(local_7f0.hit + 0xf4);
            iVar93 = *(int *)(local_7f0.hit + 0xf8);
            iVar94 = *(int *)(local_7f0.hit + 0xfc);
            bVar14 = (bool)((byte)(uVar76 >> 1) & 1);
            bVar15 = (bool)((byte)(uVar76 >> 2) & 1);
            bVar16 = (bool)((byte)(uVar76 >> 3) & 1);
            bVar17 = (bool)((byte)(uVar76 >> 4) & 1);
            bVar18 = (bool)((byte)(uVar76 >> 5) & 1);
            bVar19 = (bool)((byte)(uVar76 >> 6) & 1);
            bVar20 = (bool)((byte)(uVar76 >> 7) & 1);
            bVar21 = (bool)((byte)(uVar76 >> 9) & 1);
            bVar22 = (bool)((byte)(uVar76 >> 10) & 1);
            bVar23 = (bool)((byte)(uVar76 >> 0xb) & 1);
            bVar24 = (bool)((byte)(uVar76 >> 0xc) & 1);
            bVar30 = (bool)((byte)(uVar76 >> 0xd) & 1);
            bVar31 = (bool)((byte)(uVar76 >> 0xe) & 1);
            bVar38 = SUB81(uVar76 >> 0xf,0);
            *(uint *)(local_7f0.ray + 0x3c0) =
                 (uint)(bVar95 & 1) * *(int *)(local_7f0.hit + 0xc0) |
                 (uint)!(bool)(bVar95 & 1) * *(int *)(local_7f0.ray + 0x3c0);
            *(uint *)(local_7f0.ray + 0x3c4) =
                 (uint)bVar14 * iVar105 | (uint)!bVar14 * *(int *)(local_7f0.ray + 0x3c4);
            *(uint *)(local_7f0.ray + 0x3c8) =
                 (uint)bVar15 * iVar141 | (uint)!bVar15 * *(int *)(local_7f0.ray + 0x3c8);
            *(uint *)(local_7f0.ray + 0x3cc) =
                 (uint)bVar16 * iVar142 | (uint)!bVar16 * *(int *)(local_7f0.ray + 0x3cc);
            *(uint *)(local_7f0.ray + 0x3d0) =
                 (uint)bVar17 * iVar143 | (uint)!bVar17 * *(int *)(local_7f0.ray + 0x3d0);
            *(uint *)(local_7f0.ray + 0x3d4) =
                 (uint)bVar18 * iVar144 | (uint)!bVar18 * *(int *)(local_7f0.ray + 0x3d4);
            *(uint *)(local_7f0.ray + 0x3d8) =
                 (uint)bVar19 * iVar145 | (uint)!bVar19 * *(int *)(local_7f0.ray + 0x3d8);
            *(uint *)(local_7f0.ray + 0x3dc) =
                 (uint)bVar20 * iVar146 | (uint)!bVar20 * *(int *)(local_7f0.ray + 0x3dc);
            *(uint *)(local_7f0.ray + 0x3e0) =
                 (uint)(bVar78 & 1) * iVar147 |
                 (uint)!(bool)(bVar78 & 1) * *(int *)(local_7f0.ray + 0x3e0);
            *(uint *)(local_7f0.ray + 0x3e4) =
                 (uint)bVar21 * iVar88 | (uint)!bVar21 * *(int *)(local_7f0.ray + 0x3e4);
            *(uint *)(local_7f0.ray + 1000) =
                 (uint)bVar22 * iVar89 | (uint)!bVar22 * *(int *)(local_7f0.ray + 1000);
            *(uint *)(local_7f0.ray + 0x3ec) =
                 (uint)bVar23 * iVar90 | (uint)!bVar23 * *(int *)(local_7f0.ray + 0x3ec);
            *(uint *)(local_7f0.ray + 0x3f0) =
                 (uint)bVar24 * iVar91 | (uint)!bVar24 * *(int *)(local_7f0.ray + 0x3f0);
            *(uint *)(local_7f0.ray + 0x3f4) =
                 (uint)bVar30 * iVar92 | (uint)!bVar30 * *(int *)(local_7f0.ray + 0x3f4);
            *(uint *)(local_7f0.ray + 0x3f8) =
                 (uint)bVar31 * iVar93 | (uint)!bVar31 * *(int *)(local_7f0.ray + 0x3f8);
            *(uint *)(local_7f0.ray + 0x3fc) =
                 (uint)bVar38 * iVar94 | (uint)!bVar38 * *(int *)(local_7f0.ray + 0x3fc);
            iVar105 = *(int *)(local_7f0.hit + 0x104);
            iVar141 = *(int *)(local_7f0.hit + 0x108);
            iVar142 = *(int *)(local_7f0.hit + 0x10c);
            iVar143 = *(int *)(local_7f0.hit + 0x110);
            iVar144 = *(int *)(local_7f0.hit + 0x114);
            iVar145 = *(int *)(local_7f0.hit + 0x118);
            iVar146 = *(int *)(local_7f0.hit + 0x11c);
            iVar147 = *(int *)(local_7f0.hit + 0x120);
            iVar88 = *(int *)(local_7f0.hit + 0x124);
            iVar89 = *(int *)(local_7f0.hit + 0x128);
            iVar90 = *(int *)(local_7f0.hit + 300);
            iVar91 = *(int *)(local_7f0.hit + 0x130);
            iVar92 = *(int *)(local_7f0.hit + 0x134);
            iVar93 = *(int *)(local_7f0.hit + 0x138);
            iVar94 = *(int *)(local_7f0.hit + 0x13c);
            bVar14 = (bool)((byte)(uVar76 >> 1) & 1);
            bVar15 = (bool)((byte)(uVar76 >> 2) & 1);
            bVar16 = (bool)((byte)(uVar76 >> 3) & 1);
            bVar17 = (bool)((byte)(uVar76 >> 4) & 1);
            bVar18 = (bool)((byte)(uVar76 >> 5) & 1);
            bVar19 = (bool)((byte)(uVar76 >> 6) & 1);
            bVar20 = (bool)((byte)(uVar76 >> 7) & 1);
            bVar21 = (bool)((byte)(uVar76 >> 9) & 1);
            bVar22 = (bool)((byte)(uVar76 >> 10) & 1);
            bVar23 = (bool)((byte)(uVar76 >> 0xb) & 1);
            bVar24 = (bool)((byte)(uVar76 >> 0xc) & 1);
            bVar30 = (bool)((byte)(uVar76 >> 0xd) & 1);
            bVar31 = (bool)((byte)(uVar76 >> 0xe) & 1);
            bVar38 = SUB81(uVar76 >> 0xf,0);
            *(uint *)(local_7f0.ray + 0x400) =
                 (uint)(bVar95 & 1) * *(int *)(local_7f0.hit + 0x100) |
                 (uint)!(bool)(bVar95 & 1) * *(int *)(local_7f0.ray + 0x400);
            *(uint *)(local_7f0.ray + 0x404) =
                 (uint)bVar14 * iVar105 | (uint)!bVar14 * *(int *)(local_7f0.ray + 0x404);
            *(uint *)(local_7f0.ray + 0x408) =
                 (uint)bVar15 * iVar141 | (uint)!bVar15 * *(int *)(local_7f0.ray + 0x408);
            *(uint *)(local_7f0.ray + 0x40c) =
                 (uint)bVar16 * iVar142 | (uint)!bVar16 * *(int *)(local_7f0.ray + 0x40c);
            *(uint *)(local_7f0.ray + 0x410) =
                 (uint)bVar17 * iVar143 | (uint)!bVar17 * *(int *)(local_7f0.ray + 0x410);
            *(uint *)(local_7f0.ray + 0x414) =
                 (uint)bVar18 * iVar144 | (uint)!bVar18 * *(int *)(local_7f0.ray + 0x414);
            *(uint *)(local_7f0.ray + 0x418) =
                 (uint)bVar19 * iVar145 | (uint)!bVar19 * *(int *)(local_7f0.ray + 0x418);
            *(uint *)(local_7f0.ray + 0x41c) =
                 (uint)bVar20 * iVar146 | (uint)!bVar20 * *(int *)(local_7f0.ray + 0x41c);
            *(uint *)(local_7f0.ray + 0x420) =
                 (uint)(bVar78 & 1) * iVar147 |
                 (uint)!(bool)(bVar78 & 1) * *(int *)(local_7f0.ray + 0x420);
            *(uint *)(local_7f0.ray + 0x424) =
                 (uint)bVar21 * iVar88 | (uint)!bVar21 * *(int *)(local_7f0.ray + 0x424);
            *(uint *)(local_7f0.ray + 0x428) =
                 (uint)bVar22 * iVar89 | (uint)!bVar22 * *(int *)(local_7f0.ray + 0x428);
            *(uint *)(local_7f0.ray + 0x42c) =
                 (uint)bVar23 * iVar90 | (uint)!bVar23 * *(int *)(local_7f0.ray + 0x42c);
            *(uint *)(local_7f0.ray + 0x430) =
                 (uint)bVar24 * iVar91 | (uint)!bVar24 * *(int *)(local_7f0.ray + 0x430);
            *(uint *)(local_7f0.ray + 0x434) =
                 (uint)bVar30 * iVar92 | (uint)!bVar30 * *(int *)(local_7f0.ray + 0x434);
            *(uint *)(local_7f0.ray + 0x438) =
                 (uint)bVar31 * iVar93 | (uint)!bVar31 * *(int *)(local_7f0.ray + 0x438);
            *(uint *)(local_7f0.ray + 0x43c) =
                 (uint)bVar38 * iVar94 | (uint)!bVar38 * *(int *)(local_7f0.ray + 0x43c);
            auVar165 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_7f0.hit + 0x140));
            auVar165 = vmovdqu32_avx512f(auVar165);
            *(undefined1 (*) [64])(local_7f0.ray + 0x440) = auVar165;
            auVar165 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_7f0.hit + 0x180));
            auVar165 = vmovdqu32_avx512f(auVar165);
            *(undefined1 (*) [64])(local_7f0.ray + 0x480) = auVar165;
            auVar165 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_7f0.hit + 0x1c0));
            auVar165 = vmovdqa32_avx512f(auVar165);
            *(undefined1 (*) [64])(local_7f0.ray + 0x4c0) = auVar165;
            auVar165 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_7f0.hit + 0x200));
            auVar110 = auVar165._0_32_;
            auVar165 = vmovdqa32_avx512f(auVar165);
            *(undefined1 (*) [64])(local_7f0.ray + 0x500) = auVar165;
          }
          uVar4 = *(undefined4 *)(ray + k * 4 + 0x200);
          auVar109._4_4_ = uVar4;
          auVar109._0_4_ = uVar4;
          auVar109._8_4_ = uVar4;
          auVar109._12_4_ = uVar4;
          auVar109._16_4_ = uVar4;
          auVar109._20_4_ = uVar4;
          auVar109._24_4_ = uVar4;
          auVar109._28_4_ = uVar4;
          uVar71 = vcmpps_avx512vl(auVar158._0_32_,auVar109,2);
          uVar101 = (uint)(byte)(~(byte)(1 << (uVar97 & 0x1f)) & (byte)uVar101) & (uint)uVar71;
          uVar103 = uVar104;
          iVar141 = local_4c0;
          iVar105 = iStack_4bc;
          iVar142 = iStack_4b8;
          iVar143 = iStack_4b4;
          iVar144 = iStack_4b0;
          iVar145 = iStack_4ac;
          iVar146 = iStack_4a8;
          iVar147 = iStack_4a4;
          goto LAB_01cee0ba;
        }
        bVar14 = false;
      }
      if (bVar14) {
        bVar95 = (byte)uVar101;
        if (bVar95 == 0) goto LAB_01cee729;
        auVar111 = vblendmps_avx512vl(auVar193._0_32_,auVar158._0_32_);
        auVar107._0_4_ =
             (uint)(bVar95 & 1) * auVar111._0_4_ | (uint)!(bool)(bVar95 & 1) * auVar110._0_4_;
        bVar14 = (bool)((byte)(uVar101 >> 1) & 1);
        auVar107._4_4_ = (uint)bVar14 * auVar111._4_4_ | (uint)!bVar14 * auVar110._4_4_;
        bVar14 = (bool)((byte)(uVar101 >> 2) & 1);
        auVar107._8_4_ = (uint)bVar14 * auVar111._8_4_ | (uint)!bVar14 * auVar110._8_4_;
        bVar14 = (bool)((byte)(uVar101 >> 3) & 1);
        auVar107._12_4_ = (uint)bVar14 * auVar111._12_4_ | (uint)!bVar14 * auVar110._12_4_;
        bVar14 = (bool)((byte)(uVar101 >> 4) & 1);
        auVar107._16_4_ = (uint)bVar14 * auVar111._16_4_ | (uint)!bVar14 * auVar110._16_4_;
        bVar14 = (bool)((byte)(uVar101 >> 5) & 1);
        auVar107._20_4_ = (uint)bVar14 * auVar111._20_4_ | (uint)!bVar14 * auVar110._20_4_;
        bVar14 = (bool)((byte)(uVar101 >> 6) & 1);
        auVar107._24_4_ = (uint)bVar14 * auVar111._24_4_ | (uint)!bVar14 * auVar110._24_4_;
        auVar107._28_4_ =
             (uVar101 >> 7) * auVar111._28_4_ | (uint)!SUB41(uVar101 >> 7,0) * auVar110._28_4_;
        auVar110 = vshufps_avx(auVar107,auVar107,0xb1);
        auVar110 = vminps_avx(auVar107,auVar110);
        auVar111 = vshufpd_avx(auVar110,auVar110,5);
        auVar110 = vminps_avx(auVar110,auVar111);
        auVar111 = vpermpd_avx2(auVar110,0x4e);
        auVar110 = vminps_avx(auVar110,auVar111);
        uVar71 = vcmpps_avx512vl(auVar107,auVar110,0);
        bVar95 = (byte)uVar71 & bVar95;
        uVar98 = uVar101;
        if (bVar95 != 0) {
          uVar98 = (uint)bVar95;
        }
        uVar97 = 0;
        for (; (uVar98 & 1) == 0; uVar98 = uVar98 >> 1 | 0x80000000) {
          uVar97 = uVar97 + 1;
        }
        goto LAB_01cee06b;
      }
      uVar104 = (ulong)(uVar99 << 2);
      uVar4 = *(undefined4 *)((long)local_780 + uVar104);
      uVar5 = *(undefined4 *)(local_760 + uVar104);
      *(undefined4 *)(ray + k * 4 + 0x200) = *(undefined4 *)(local_740 + uVar104);
      *(undefined4 *)(ray + k * 4 + 0x300) = *(undefined4 *)((long)local_720 + uVar104);
      *(undefined4 *)(ray + k * 4 + 0x340) = *(undefined4 *)((long)local_700 + uVar104);
      *(undefined4 *)(ray + k * 4 + 0x380) = *(undefined4 *)((long)local_6e0 + uVar104);
      *(undefined4 *)(ray + k * 4 + 0x3c0) = uVar4;
      *(undefined4 *)(ray + k * 4 + 0x400) = uVar5;
      *(undefined4 *)(ray + k * 4 + 0x440) =
           *(undefined4 *)((long)&(line->primIDs).field_0 + uVar104);
      *(uint *)(ray + k * 4 + 0x480) = uVar98;
      *(uint *)(ray + k * 4 + 0x4c0) = context->user->instID[0];
      *(uint *)(ray + k * 4 + 0x500) = context->user->instPrimID[0];
LAB_01cee729:
      uVar4 = *(undefined4 *)(ray + k * 4 + 0x200);
      auVar79._4_4_ = uVar4;
      auVar79._0_4_ = uVar4;
      auVar79._8_4_ = uVar4;
      auVar79._12_4_ = uVar4;
      auVar79._16_4_ = uVar4;
      auVar79._20_4_ = uVar4;
      auVar79._24_4_ = uVar4;
      auVar79._28_4_ = uVar4;
      local_740 = auVar175._0_32_;
      uVar71 = vcmpps_avx512vl(local_740,auVar79,2);
      bVar96 = (byte)uVar103 & (byte)uVar71 & bVar100 & bVar96;
      uVar101 = (uint)bVar96;
      if (bVar96 != 0) {
        auVar112 = auVar188._0_32_;
        uVar71 = vcmpps_avx512vl(auVar112,auVar186._0_32_,0);
        uVar72 = vcmpps_avx512vl(auVar112,auVar187._0_32_,0);
        bVar78 = (byte)uVar71 | (byte)uVar72;
        uVar104 = vcmpps_avx512vl(auVar112,auVar192._0_32_,0);
        auVar110 = vmulps_avx512vl(auVar194._0_32_,auVar112);
        auVar111 = vmulps_avx512vl(auVar195._0_32_,auVar112);
        auVar112 = vmulps_avx512vl(auVar196._0_32_,auVar112);
        auVar149._0_4_ = auVar110._0_4_ + (float)local_680._0_4_;
        auVar149._4_4_ = auVar110._4_4_ + (float)local_680._4_4_;
        auVar149._8_4_ = auVar110._8_4_ + fStack_678;
        auVar149._12_4_ = auVar110._12_4_ + fStack_674;
        auVar149._16_4_ = auVar110._16_4_ + fStack_670;
        auVar149._20_4_ = auVar110._20_4_ + fStack_66c;
        auVar149._24_4_ = auVar110._24_4_ + fStack_668;
        auVar149._28_4_ = auVar110._28_4_ + fStack_664;
        auVar151._0_4_ = auVar111._0_4_ + (float)local_7a0._0_4_;
        auVar151._4_4_ = auVar111._4_4_ + (float)local_7a0._4_4_;
        auVar151._8_4_ = auVar111._8_4_ + fStack_798;
        auVar151._12_4_ = auVar111._12_4_ + fStack_794;
        auVar151._16_4_ = auVar111._16_4_ + fStack_790;
        auVar151._20_4_ = auVar111._20_4_ + fStack_78c;
        auVar151._24_4_ = auVar111._24_4_ + fStack_788;
        auVar151._28_4_ = auVar111._28_4_ + fStack_784;
        auVar110 = vaddps_avx512vl(auVar202._0_32_,auVar112);
        auVar120 = auVar203._0_32_;
        auVar111 = vmulps_avx512vl(auVar120,auVar149);
        auVar112 = vmulps_avx512vl(auVar120,auVar151);
        auVar110 = vmulps_avx512vl(auVar120,auVar110);
        auVar150._0_4_ = auVar111._0_4_ + (float)local_320._0_4_;
        auVar150._4_4_ = auVar111._4_4_ + (float)local_320._4_4_;
        auVar150._8_4_ = auVar111._8_4_ + fStack_318;
        auVar150._12_4_ = auVar111._12_4_ + fStack_314;
        auVar150._16_4_ = auVar111._16_4_ + fStack_310;
        auVar150._20_4_ = auVar111._20_4_ + fStack_30c;
        auVar150._24_4_ = auVar111._24_4_ + fStack_308;
        auVar150._28_4_ = auVar111._28_4_ + fStack_304;
        auVar111 = vaddps_avx512vl(auVar189._0_32_,auVar112);
        auVar153._0_4_ = auVar157._0_4_ + auVar110._0_4_;
        auVar153._4_4_ = auVar157._4_4_ + auVar110._4_4_;
        auVar153._8_4_ = auVar157._8_4_ + auVar110._8_4_;
        auVar153._12_4_ = auVar157._12_4_ + auVar110._12_4_;
        auVar153._16_4_ = auVar157._16_4_ + auVar110._16_4_;
        auVar153._20_4_ = auVar157._20_4_ + auVar110._20_4_;
        auVar153._24_4_ = auVar157._24_4_ + auVar110._24_4_;
        auVar153._28_4_ = auVar157._28_4_ + auVar110._28_4_;
        auVar116 = auVar201._0_32_;
        auVar110 = vmulps_avx512vl(auVar190._0_32_,auVar116);
        auVar112 = vmulps_avx512vl(auVar191._0_32_,auVar116);
        auVar138 = auVar169._0_32_;
        auVar120 = vmulps_avx512vl(auVar138,auVar116);
        bVar95 = (byte)uVar104;
        bVar14 = (bool)((byte)(uVar104 >> 1) & 1);
        bVar20 = (bool)((byte)(uVar104 >> 2) & 1);
        bVar31 = (bool)((byte)(uVar104 >> 3) & 1);
        bVar49 = (bool)((byte)(uVar104 >> 4) & 1);
        bVar32 = (bool)((byte)(uVar104 >> 5) & 1);
        bVar41 = (bool)((byte)(uVar104 >> 6) & 1);
        bVar50 = SUB81(uVar104 >> 7,0);
        bVar15 = (bool)((byte)(uVar104 >> 1) & 1);
        bVar21 = (bool)((byte)(uVar104 >> 2) & 1);
        bVar38 = (bool)((byte)(uVar104 >> 3) & 1);
        bVar25 = (bool)((byte)(uVar104 >> 4) & 1);
        bVar33 = (bool)((byte)(uVar104 >> 5) & 1);
        bVar42 = (bool)((byte)(uVar104 >> 6) & 1);
        bVar51 = SUB81(uVar104 >> 7,0);
        bVar16 = (bool)((byte)(uVar104 >> 1) & 1);
        bVar22 = (bool)((byte)(uVar104 >> 2) & 1);
        bVar39 = (bool)((byte)(uVar104 >> 3) & 1);
        bVar26 = (bool)((byte)(uVar104 >> 4) & 1);
        bVar34 = (bool)((byte)(uVar104 >> 5) & 1);
        bVar43 = (bool)((byte)(uVar104 >> 6) & 1);
        bVar52 = SUB81(uVar104 >> 7,0);
        auVar110 = vsubps_avx512vl(auVar150,auVar110);
        bVar17 = (bool)(bVar78 >> 1 & 1);
        bVar23 = (bool)(bVar78 >> 2 & 1);
        bVar47 = (bool)(bVar78 >> 3 & 1);
        bVar27 = (bool)(bVar78 >> 4 & 1);
        bVar35 = (bool)(bVar78 >> 5 & 1);
        bVar44 = (bool)(bVar78 >> 6 & 1);
        auVar111 = vsubps_avx512vl(auVar111,auVar112);
        bVar18 = (bool)(bVar78 >> 1 & 1);
        bVar24 = (bool)(bVar78 >> 2 & 1);
        bVar48 = (bool)(bVar78 >> 3 & 1);
        bVar28 = (bool)(bVar78 >> 4 & 1);
        bVar36 = (bool)(bVar78 >> 5 & 1);
        bVar45 = (bool)(bVar78 >> 6 & 1);
        auVar112 = vmulps_avx512vl(auVar116,auVar183._0_32_);
        bVar19 = (bool)(bVar78 >> 1 & 1);
        bVar30 = (bool)(bVar78 >> 2 & 1);
        bVar40 = (bool)(bVar78 >> 3 & 1);
        bVar29 = (bool)(bVar78 >> 4 & 1);
        bVar37 = (bool)(bVar78 >> 5 & 1);
        bVar46 = (bool)(bVar78 >> 6 & 1);
        local_780[0] = (uint)(bVar78 & 1) * auVar112._0_4_ | (uint)!(bool)(bVar78 & 1) * iVar141;
        local_780[1] = (uint)bVar19 * auVar112._4_4_ | (uint)!bVar19 * iVar105;
        local_780[2] = (uint)bVar30 * auVar112._8_4_ | (uint)!bVar30 * iVar142;
        local_780[3] = (uint)bVar40 * auVar112._12_4_ | (uint)!bVar40 * iVar143;
        uStack_770 = (uint)bVar29 * auVar112._16_4_ | (uint)!bVar29 * iVar144;
        uStack_76c = (uint)bVar37 * auVar112._20_4_ | (uint)!bVar37 * iVar145;
        uStack_768 = (uint)bVar46 * auVar112._24_4_ | (uint)!bVar46 * iVar146;
        uStack_764 = (uint)(bVar78 >> 7) * auVar112._28_4_ | (uint)!(bool)(bVar78 >> 7) * iVar147;
        local_760 = ZEXT432(0) << 0x20;
        local_720[0] = (uint)(bVar78 & 1) * auVar110._0_4_ |
                       (uint)!(bool)(bVar78 & 1) *
                       ((uint)(bVar95 & 1) * auVar200._0_4_ |
                       (uint)!(bool)(bVar95 & 1) * auVar199._0_4_);
        local_720[1] = (uint)bVar17 * auVar110._4_4_ |
                       (uint)!bVar17 *
                       ((uint)bVar14 * auVar200._4_4_ | (uint)!bVar14 * auVar199._4_4_);
        local_720[2] = (uint)bVar23 * auVar110._8_4_ |
                       (uint)!bVar23 *
                       ((uint)bVar20 * auVar200._8_4_ | (uint)!bVar20 * auVar199._8_4_);
        local_720[3] = (uint)bVar47 * auVar110._12_4_ |
                       (uint)!bVar47 *
                       ((uint)bVar31 * auVar200._12_4_ | (uint)!bVar31 * auVar199._12_4_);
        uStack_710 = (uint)bVar27 * auVar110._16_4_ |
                     (uint)!bVar27 *
                     ((uint)bVar49 * auVar200._16_4_ | (uint)!bVar49 * auVar199._16_4_);
        uStack_70c = (uint)bVar35 * auVar110._20_4_ |
                     (uint)!bVar35 *
                     ((uint)bVar32 * auVar200._20_4_ | (uint)!bVar32 * auVar199._20_4_);
        uStack_708 = (uint)bVar44 * auVar110._24_4_ |
                     (uint)!bVar44 *
                     ((uint)bVar41 * auVar200._24_4_ | (uint)!bVar41 * auVar199._24_4_);
        uStack_704 = (uint)(bVar78 >> 7) * auVar110._28_4_ |
                     (uint)!(bool)(bVar78 >> 7) *
                     ((uint)bVar50 * auVar200._28_4_ | (uint)!bVar50 * auVar199._28_4_);
        auVar110 = vsubps_avx512vl(auVar153,auVar120);
        bVar14 = (bool)(bVar78 >> 1 & 1);
        bVar17 = (bool)(bVar78 >> 2 & 1);
        bVar19 = (bool)(bVar78 >> 3 & 1);
        bVar20 = (bool)(bVar78 >> 4 & 1);
        bVar23 = (bool)(bVar78 >> 5 & 1);
        bVar30 = (bool)(bVar78 >> 6 & 1);
        local_700[0] = (uint)(bVar78 & 1) * auVar111._0_4_ |
                       (uint)!(bool)(bVar78 & 1) *
                       ((uint)(bVar95 & 1) * auVar171._0_4_ |
                       (uint)!(bool)(bVar95 & 1) * auVar197._0_4_);
        local_700[1] = (uint)bVar18 * auVar111._4_4_ |
                       (uint)!bVar18 *
                       ((uint)bVar15 * auVar171._4_4_ | (uint)!bVar15 * auVar197._4_4_);
        local_700[2] = (uint)bVar24 * auVar111._8_4_ |
                       (uint)!bVar24 *
                       ((uint)bVar21 * auVar171._8_4_ | (uint)!bVar21 * auVar197._8_4_);
        local_700[3] = (uint)bVar48 * auVar111._12_4_ |
                       (uint)!bVar48 *
                       ((uint)bVar38 * auVar171._12_4_ | (uint)!bVar38 * auVar197._12_4_);
        uStack_6f0 = (uint)bVar28 * auVar111._16_4_ |
                     (uint)!bVar28 *
                     ((uint)bVar25 * auVar171._16_4_ | (uint)!bVar25 * auVar197._16_4_);
        uStack_6ec = (uint)bVar36 * auVar111._20_4_ |
                     (uint)!bVar36 *
                     ((uint)bVar33 * auVar171._20_4_ | (uint)!bVar33 * auVar197._20_4_);
        uStack_6e8 = (uint)bVar45 * auVar111._24_4_ |
                     (uint)!bVar45 *
                     ((uint)bVar42 * auVar171._24_4_ | (uint)!bVar42 * auVar197._24_4_);
        uStack_6e4 = (uint)(bVar78 >> 7) * auVar111._28_4_ |
                     (uint)!(bool)(bVar78 >> 7) *
                     ((uint)bVar51 * auVar171._28_4_ | (uint)!bVar51 * auVar197._28_4_);
        local_6e0[0] = (uint)(bVar78 & 1) * auVar110._0_4_ |
                       (uint)!(bool)(bVar78 & 1) *
                       ((uint)(bVar95 & 1) * auVar162._0_4_ |
                       (uint)!(bool)(bVar95 & 1) * auVar198._0_4_);
        local_6e0[1] = (uint)bVar14 * auVar110._4_4_ |
                       (uint)!bVar14 *
                       ((uint)bVar16 * auVar162._4_4_ | (uint)!bVar16 * auVar198._4_4_);
        local_6e0[2] = (uint)bVar17 * auVar110._8_4_ |
                       (uint)!bVar17 *
                       ((uint)bVar22 * auVar162._8_4_ | (uint)!bVar22 * auVar198._8_4_);
        local_6e0[3] = (uint)bVar19 * auVar110._12_4_ |
                       (uint)!bVar19 *
                       ((uint)bVar39 * auVar162._12_4_ | (uint)!bVar39 * auVar198._12_4_);
        uStack_6d0 = (uint)bVar20 * auVar110._16_4_ |
                     (uint)!bVar20 *
                     ((uint)bVar26 * auVar162._16_4_ | (uint)!bVar26 * auVar198._16_4_);
        uStack_6cc = (uint)bVar23 * auVar110._20_4_ |
                     (uint)!bVar23 *
                     ((uint)bVar34 * auVar162._20_4_ | (uint)!bVar34 * auVar198._20_4_);
        uStack_6c8 = (uint)bVar30 * auVar110._24_4_ |
                     (uint)!bVar30 *
                     ((uint)bVar43 * auVar162._24_4_ | (uint)!bVar43 * auVar198._24_4_);
        uStack_6c4 = (uint)(bVar78 >> 7) * auVar110._28_4_ |
                     (uint)!(bool)(bVar78 >> 7) *
                     ((uint)bVar52 * auVar162._28_4_ | (uint)!bVar52 * auVar198._28_4_);
        pSVar10 = context->scene;
        auVar110 = vblendmps_avx512vl(auVar193._0_32_,local_740);
        auVar139._4_4_ = (uint)(bVar96 >> 1 & 1) * auVar110._4_4_;
        auVar139._0_4_ = (uint)(bVar96 & 1) * auVar110._0_4_;
        auVar139._8_4_ = (uint)(bVar96 >> 2 & 1) * auVar110._8_4_;
        auVar139._12_4_ = (uint)(bVar96 >> 3 & 1) * auVar110._12_4_;
        auVar139._16_4_ = (uint)(bVar96 >> 4 & 1) * auVar110._16_4_;
        auVar139._20_4_ = (uint)(bVar96 >> 5 & 1) * auVar110._20_4_;
        auVar139._24_4_ = (uint)(bVar96 >> 6 & 1) * auVar110._24_4_;
        auVar139._28_4_ = (uint)(bVar96 >> 7) * auVar110._28_4_;
        auVar110 = vshufps_avx(auVar139,auVar139,0xb1);
        auVar110 = vminps_avx(auVar139,auVar110);
        auVar111 = vshufpd_avx(auVar110,auVar110,5);
        auVar110 = vminps_avx(auVar110,auVar111);
        auVar111 = vpermpd_avx2(auVar110,0x4e);
        auVar110 = vminps_avx(auVar110,auVar111);
        uVar71 = vcmpps_avx512vl(auVar139,auVar110,0);
        uVar98 = uVar101;
        if (((byte)uVar71 & bVar96) != 0) {
          uVar98 = (uint)((byte)uVar71 & bVar96);
        }
        uVar97 = 0;
        for (; (uVar98 & 1) == 0; uVar98 = uVar98 >> 1 | 0x80000000) {
          uVar97 = uVar97 + 1;
        }
        auVar165 = vpmovm2d_avx512dq((ulong)(uint)(1 << ((uint)k & 0x1f)));
        auVar110 = vpcmpeqd_avx2(auVar138,auVar138);
        auVar194 = ZEXT3264(auVar110);
        do {
          local_7f0.valid = (int *)local_6c0;
          uVar99 = uVar97 & 0xff;
          uVar98 = *(uint *)(local_340 + (ulong)uVar99 * 4);
          pGVar11 = (pSVar10->geometries).items[uVar98].ptr;
          if ((pGVar11->mask & *(uint *)(ray + k * 4 + 0x240)) == 0) {
            uVar101 = (uint)(byte)(~(byte)(1 << (uVar97 & 0x1f)) & (byte)uVar101);
LAB_01cee8cd:
            bVar14 = true;
          }
          else {
            if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
               (pGVar11->intersectionFilterN != (RTCFilterFunctionN)0x0)) {
              uVar104 = (ulong)(uVar99 * 4);
              local_200 = vbroadcastss_avx512f(ZEXT416(*(uint *)((long)local_780 + uVar104)));
              local_1c0 = vbroadcastss_avx512f(ZEXT416(*(uint *)(local_760 + uVar104)));
              auVar195 = vpbroadcastd_avx512f();
              local_180 = vbroadcastss_avx512f
                                    (ZEXT416(*(uint *)((long)&(line->primIDs).field_0 + uVar104)));
              auVar196 = vbroadcastss_avx512f(ZEXT416(*(uint *)((long)local_720 + uVar104)));
              local_280 = vbroadcastss_avx512f(ZEXT416(*(uint *)((long)local_700 + uVar104)));
              local_240 = vbroadcastss_avx512f(ZEXT416(*(uint *)((long)local_6e0 + uVar104)));
              local_2c0[0] = (RTCHitN)auVar196[0];
              local_2c0[1] = (RTCHitN)auVar196[1];
              local_2c0[2] = (RTCHitN)auVar196[2];
              local_2c0[3] = (RTCHitN)auVar196[3];
              local_2c0[4] = (RTCHitN)auVar196[4];
              local_2c0[5] = (RTCHitN)auVar196[5];
              local_2c0[6] = (RTCHitN)auVar196[6];
              local_2c0[7] = (RTCHitN)auVar196[7];
              local_2c0[8] = (RTCHitN)auVar196[8];
              local_2c0[9] = (RTCHitN)auVar196[9];
              local_2c0[10] = (RTCHitN)auVar196[10];
              local_2c0[0xb] = (RTCHitN)auVar196[0xb];
              local_2c0[0xc] = (RTCHitN)auVar196[0xc];
              local_2c0[0xd] = (RTCHitN)auVar196[0xd];
              local_2c0[0xe] = (RTCHitN)auVar196[0xe];
              local_2c0[0xf] = (RTCHitN)auVar196[0xf];
              local_2c0[0x10] = (RTCHitN)auVar196[0x10];
              local_2c0[0x11] = (RTCHitN)auVar196[0x11];
              local_2c0[0x12] = (RTCHitN)auVar196[0x12];
              local_2c0[0x13] = (RTCHitN)auVar196[0x13];
              local_2c0[0x14] = (RTCHitN)auVar196[0x14];
              local_2c0[0x15] = (RTCHitN)auVar196[0x15];
              local_2c0[0x16] = (RTCHitN)auVar196[0x16];
              local_2c0[0x17] = (RTCHitN)auVar196[0x17];
              local_2c0[0x18] = (RTCHitN)auVar196[0x18];
              local_2c0[0x19] = (RTCHitN)auVar196[0x19];
              local_2c0[0x1a] = (RTCHitN)auVar196[0x1a];
              local_2c0[0x1b] = (RTCHitN)auVar196[0x1b];
              local_2c0[0x1c] = (RTCHitN)auVar196[0x1c];
              local_2c0[0x1d] = (RTCHitN)auVar196[0x1d];
              local_2c0[0x1e] = (RTCHitN)auVar196[0x1e];
              local_2c0[0x1f] = (RTCHitN)auVar196[0x1f];
              local_2c0[0x20] = (RTCHitN)auVar196[0x20];
              local_2c0[0x21] = (RTCHitN)auVar196[0x21];
              local_2c0[0x22] = (RTCHitN)auVar196[0x22];
              local_2c0[0x23] = (RTCHitN)auVar196[0x23];
              local_2c0[0x24] = (RTCHitN)auVar196[0x24];
              local_2c0[0x25] = (RTCHitN)auVar196[0x25];
              local_2c0[0x26] = (RTCHitN)auVar196[0x26];
              local_2c0[0x27] = (RTCHitN)auVar196[0x27];
              local_2c0[0x28] = (RTCHitN)auVar196[0x28];
              local_2c0[0x29] = (RTCHitN)auVar196[0x29];
              local_2c0[0x2a] = (RTCHitN)auVar196[0x2a];
              local_2c0[0x2b] = (RTCHitN)auVar196[0x2b];
              local_2c0[0x2c] = (RTCHitN)auVar196[0x2c];
              local_2c0[0x2d] = (RTCHitN)auVar196[0x2d];
              local_2c0[0x2e] = (RTCHitN)auVar196[0x2e];
              local_2c0[0x2f] = (RTCHitN)auVar196[0x2f];
              local_2c0[0x30] = (RTCHitN)auVar196[0x30];
              local_2c0[0x31] = (RTCHitN)auVar196[0x31];
              local_2c0[0x32] = (RTCHitN)auVar196[0x32];
              local_2c0[0x33] = (RTCHitN)auVar196[0x33];
              local_2c0[0x34] = (RTCHitN)auVar196[0x34];
              local_2c0[0x35] = (RTCHitN)auVar196[0x35];
              local_2c0[0x36] = (RTCHitN)auVar196[0x36];
              local_2c0[0x37] = (RTCHitN)auVar196[0x37];
              local_2c0[0x38] = (RTCHitN)auVar196[0x38];
              local_2c0[0x39] = (RTCHitN)auVar196[0x39];
              local_2c0[0x3a] = (RTCHitN)auVar196[0x3a];
              local_2c0[0x3b] = (RTCHitN)auVar196[0x3b];
              local_2c0[0x3c] = (RTCHitN)auVar196[0x3c];
              local_2c0[0x3d] = (RTCHitN)auVar196[0x3d];
              local_2c0[0x3e] = (RTCHitN)auVar196[0x3e];
              local_2c0[0x3f] = (RTCHitN)auVar196[0x3f];
              local_140 = vmovdqa64_avx512f(auVar195);
              local_100 = vbroadcastss_avx512f(ZEXT416(context->user->instID[0]));
              local_c0 = vbroadcastss_avx512f(ZEXT416(context->user->instPrimID[0]));
              local_7a0._0_4_ = *(undefined4 *)(ray + k * 4 + 0x200);
              *(undefined4 *)(ray + k * 4 + 0x200) = *(undefined4 *)(local_740 + uVar104);
              local_6c0 = vmovdqa64_avx512f(auVar165);
              local_7f0.geometryUserPtr = pGVar11->userPtr;
              local_7f0.context = context->user;
              local_7f0.hit = local_2c0;
              local_7f0.N = 0x10;
              local_7c0 = auVar175._0_32_;
              _local_680 = vmovdqa64_avx512f(auVar165);
              local_7f0.ray = (RTCRayN *)ray;
              if (pGVar11->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                auVar110 = ZEXT1632(auVar194._0_16_);
                (*pGVar11->intersectionFilterN)(&local_7f0);
                auVar110 = vpcmpeqd_avx2(auVar110,auVar110);
                auVar194 = ZEXT3264(auVar110);
                auVar165 = vmovdqa64_avx512f(_local_680);
                auVar175 = ZEXT3264(local_7c0);
                auVar110 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                auVar193 = ZEXT3264(auVar110);
              }
              auVar195 = vmovdqa64_avx512f(local_6c0);
              uVar71 = vptestmd_avx512f(auVar195,auVar195);
              if ((short)uVar71 == 0) {
LAB_01ceebda:
                auVar139 = ZEXT432((uint)local_7a0._0_4_);
                *(undefined4 *)(ray + k * 4 + 0x200) = local_7a0._0_4_;
              }
              else {
                p_Var13 = context->args->filter;
                if ((p_Var13 != (RTCFilterFunctionN)0x0) &&
                   (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                     RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar11->field_8).field_0x2 & 0x40) != 0)))
                   ) {
                  auVar110 = ZEXT1632(auVar194._0_16_);
                  (*p_Var13)(&local_7f0);
                  auVar110 = vpcmpeqd_avx2(auVar110,auVar110);
                  auVar194 = ZEXT3264(auVar110);
                  auVar165 = vmovdqa64_avx512f(_local_680);
                  auVar175 = ZEXT3264(local_7c0);
                  auVar110 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                  auVar193 = ZEXT3264(auVar110);
                }
                auVar195 = vmovdqa64_avx512f(local_6c0);
                uVar104 = vptestmd_avx512f(auVar195,auVar195);
                if ((short)uVar104 == 0) goto LAB_01ceebda;
                iVar105 = *(int *)(local_7f0.hit + 4);
                iVar141 = *(int *)(local_7f0.hit + 8);
                iVar142 = *(int *)(local_7f0.hit + 0xc);
                iVar143 = *(int *)(local_7f0.hit + 0x10);
                iVar144 = *(int *)(local_7f0.hit + 0x14);
                iVar145 = *(int *)(local_7f0.hit + 0x18);
                iVar146 = *(int *)(local_7f0.hit + 0x1c);
                iVar147 = *(int *)(local_7f0.hit + 0x20);
                iVar88 = *(int *)(local_7f0.hit + 0x24);
                iVar89 = *(int *)(local_7f0.hit + 0x28);
                iVar90 = *(int *)(local_7f0.hit + 0x2c);
                iVar91 = *(int *)(local_7f0.hit + 0x30);
                iVar92 = *(int *)(local_7f0.hit + 0x34);
                iVar93 = *(int *)(local_7f0.hit + 0x38);
                iVar94 = *(int *)(local_7f0.hit + 0x3c);
                bVar96 = (byte)uVar104;
                bVar14 = (bool)((byte)(uVar104 >> 1) & 1);
                bVar15 = (bool)((byte)(uVar104 >> 2) & 1);
                bVar16 = (bool)((byte)(uVar104 >> 3) & 1);
                bVar17 = (bool)((byte)(uVar104 >> 4) & 1);
                bVar18 = (bool)((byte)(uVar104 >> 5) & 1);
                bVar19 = (bool)((byte)(uVar104 >> 6) & 1);
                bVar20 = (bool)((byte)(uVar104 >> 7) & 1);
                bVar95 = (byte)(uVar104 >> 8);
                bVar21 = (bool)((byte)(uVar104 >> 9) & 1);
                bVar22 = (bool)((byte)(uVar104 >> 10) & 1);
                bVar23 = (bool)((byte)(uVar104 >> 0xb) & 1);
                bVar24 = (bool)((byte)(uVar104 >> 0xc) & 1);
                bVar30 = (bool)((byte)(uVar104 >> 0xd) & 1);
                bVar31 = (bool)((byte)(uVar104 >> 0xe) & 1);
                bVar38 = SUB81(uVar104 >> 0xf,0);
                *(uint *)(local_7f0.ray + 0x300) =
                     (uint)(bVar96 & 1) * *(int *)local_7f0.hit |
                     (uint)!(bool)(bVar96 & 1) * *(int *)(local_7f0.ray + 0x300);
                *(uint *)(local_7f0.ray + 0x304) =
                     (uint)bVar14 * iVar105 | (uint)!bVar14 * *(int *)(local_7f0.ray + 0x304);
                *(uint *)(local_7f0.ray + 0x308) =
                     (uint)bVar15 * iVar141 | (uint)!bVar15 * *(int *)(local_7f0.ray + 0x308);
                *(uint *)(local_7f0.ray + 0x30c) =
                     (uint)bVar16 * iVar142 | (uint)!bVar16 * *(int *)(local_7f0.ray + 0x30c);
                *(uint *)(local_7f0.ray + 0x310) =
                     (uint)bVar17 * iVar143 | (uint)!bVar17 * *(int *)(local_7f0.ray + 0x310);
                *(uint *)(local_7f0.ray + 0x314) =
                     (uint)bVar18 * iVar144 | (uint)!bVar18 * *(int *)(local_7f0.ray + 0x314);
                *(uint *)(local_7f0.ray + 0x318) =
                     (uint)bVar19 * iVar145 | (uint)!bVar19 * *(int *)(local_7f0.ray + 0x318);
                *(uint *)(local_7f0.ray + 0x31c) =
                     (uint)bVar20 * iVar146 | (uint)!bVar20 * *(int *)(local_7f0.ray + 0x31c);
                *(uint *)(local_7f0.ray + 800) =
                     (uint)(bVar95 & 1) * iVar147 |
                     (uint)!(bool)(bVar95 & 1) * *(int *)(local_7f0.ray + 800);
                *(uint *)(local_7f0.ray + 0x324) =
                     (uint)bVar21 * iVar88 | (uint)!bVar21 * *(int *)(local_7f0.ray + 0x324);
                *(uint *)(local_7f0.ray + 0x328) =
                     (uint)bVar22 * iVar89 | (uint)!bVar22 * *(int *)(local_7f0.ray + 0x328);
                *(uint *)(local_7f0.ray + 0x32c) =
                     (uint)bVar23 * iVar90 | (uint)!bVar23 * *(int *)(local_7f0.ray + 0x32c);
                *(uint *)(local_7f0.ray + 0x330) =
                     (uint)bVar24 * iVar91 | (uint)!bVar24 * *(int *)(local_7f0.ray + 0x330);
                *(uint *)(local_7f0.ray + 0x334) =
                     (uint)bVar30 * iVar92 | (uint)!bVar30 * *(int *)(local_7f0.ray + 0x334);
                *(uint *)(local_7f0.ray + 0x338) =
                     (uint)bVar31 * iVar93 | (uint)!bVar31 * *(int *)(local_7f0.ray + 0x338);
                *(uint *)(local_7f0.ray + 0x33c) =
                     (uint)bVar38 * iVar94 | (uint)!bVar38 * *(int *)(local_7f0.ray + 0x33c);
                iVar105 = *(int *)(local_7f0.hit + 0x44);
                iVar141 = *(int *)(local_7f0.hit + 0x48);
                iVar142 = *(int *)(local_7f0.hit + 0x4c);
                iVar143 = *(int *)(local_7f0.hit + 0x50);
                iVar144 = *(int *)(local_7f0.hit + 0x54);
                iVar145 = *(int *)(local_7f0.hit + 0x58);
                iVar146 = *(int *)(local_7f0.hit + 0x5c);
                iVar147 = *(int *)(local_7f0.hit + 0x60);
                iVar88 = *(int *)(local_7f0.hit + 100);
                iVar89 = *(int *)(local_7f0.hit + 0x68);
                iVar90 = *(int *)(local_7f0.hit + 0x6c);
                iVar91 = *(int *)(local_7f0.hit + 0x70);
                iVar92 = *(int *)(local_7f0.hit + 0x74);
                iVar93 = *(int *)(local_7f0.hit + 0x78);
                iVar94 = *(int *)(local_7f0.hit + 0x7c);
                bVar14 = (bool)((byte)(uVar104 >> 1) & 1);
                bVar15 = (bool)((byte)(uVar104 >> 2) & 1);
                bVar16 = (bool)((byte)(uVar104 >> 3) & 1);
                bVar17 = (bool)((byte)(uVar104 >> 4) & 1);
                bVar18 = (bool)((byte)(uVar104 >> 5) & 1);
                bVar19 = (bool)((byte)(uVar104 >> 6) & 1);
                bVar20 = (bool)((byte)(uVar104 >> 7) & 1);
                bVar21 = (bool)((byte)(uVar104 >> 9) & 1);
                bVar22 = (bool)((byte)(uVar104 >> 10) & 1);
                bVar23 = (bool)((byte)(uVar104 >> 0xb) & 1);
                bVar24 = (bool)((byte)(uVar104 >> 0xc) & 1);
                bVar30 = (bool)((byte)(uVar104 >> 0xd) & 1);
                bVar31 = (bool)((byte)(uVar104 >> 0xe) & 1);
                bVar38 = SUB81(uVar104 >> 0xf,0);
                *(uint *)(local_7f0.ray + 0x340) =
                     (uint)(bVar96 & 1) * *(int *)(local_7f0.hit + 0x40) |
                     (uint)!(bool)(bVar96 & 1) * *(int *)(local_7f0.ray + 0x340);
                *(uint *)(local_7f0.ray + 0x344) =
                     (uint)bVar14 * iVar105 | (uint)!bVar14 * *(int *)(local_7f0.ray + 0x344);
                *(uint *)(local_7f0.ray + 0x348) =
                     (uint)bVar15 * iVar141 | (uint)!bVar15 * *(int *)(local_7f0.ray + 0x348);
                *(uint *)(local_7f0.ray + 0x34c) =
                     (uint)bVar16 * iVar142 | (uint)!bVar16 * *(int *)(local_7f0.ray + 0x34c);
                *(uint *)(local_7f0.ray + 0x350) =
                     (uint)bVar17 * iVar143 | (uint)!bVar17 * *(int *)(local_7f0.ray + 0x350);
                *(uint *)(local_7f0.ray + 0x354) =
                     (uint)bVar18 * iVar144 | (uint)!bVar18 * *(int *)(local_7f0.ray + 0x354);
                *(uint *)(local_7f0.ray + 0x358) =
                     (uint)bVar19 * iVar145 | (uint)!bVar19 * *(int *)(local_7f0.ray + 0x358);
                *(uint *)(local_7f0.ray + 0x35c) =
                     (uint)bVar20 * iVar146 | (uint)!bVar20 * *(int *)(local_7f0.ray + 0x35c);
                *(uint *)(local_7f0.ray + 0x360) =
                     (uint)(bVar95 & 1) * iVar147 |
                     (uint)!(bool)(bVar95 & 1) * *(int *)(local_7f0.ray + 0x360);
                *(uint *)(local_7f0.ray + 0x364) =
                     (uint)bVar21 * iVar88 | (uint)!bVar21 * *(int *)(local_7f0.ray + 0x364);
                *(uint *)(local_7f0.ray + 0x368) =
                     (uint)bVar22 * iVar89 | (uint)!bVar22 * *(int *)(local_7f0.ray + 0x368);
                *(uint *)(local_7f0.ray + 0x36c) =
                     (uint)bVar23 * iVar90 | (uint)!bVar23 * *(int *)(local_7f0.ray + 0x36c);
                *(uint *)(local_7f0.ray + 0x370) =
                     (uint)bVar24 * iVar91 | (uint)!bVar24 * *(int *)(local_7f0.ray + 0x370);
                *(uint *)(local_7f0.ray + 0x374) =
                     (uint)bVar30 * iVar92 | (uint)!bVar30 * *(int *)(local_7f0.ray + 0x374);
                *(uint *)(local_7f0.ray + 0x378) =
                     (uint)bVar31 * iVar93 | (uint)!bVar31 * *(int *)(local_7f0.ray + 0x378);
                *(uint *)(local_7f0.ray + 0x37c) =
                     (uint)bVar38 * iVar94 | (uint)!bVar38 * *(int *)(local_7f0.ray + 0x37c);
                iVar105 = *(int *)(local_7f0.hit + 0x84);
                iVar141 = *(int *)(local_7f0.hit + 0x88);
                iVar142 = *(int *)(local_7f0.hit + 0x8c);
                iVar143 = *(int *)(local_7f0.hit + 0x90);
                iVar144 = *(int *)(local_7f0.hit + 0x94);
                iVar145 = *(int *)(local_7f0.hit + 0x98);
                iVar146 = *(int *)(local_7f0.hit + 0x9c);
                iVar147 = *(int *)(local_7f0.hit + 0xa0);
                iVar88 = *(int *)(local_7f0.hit + 0xa4);
                iVar89 = *(int *)(local_7f0.hit + 0xa8);
                iVar90 = *(int *)(local_7f0.hit + 0xac);
                iVar91 = *(int *)(local_7f0.hit + 0xb0);
                iVar92 = *(int *)(local_7f0.hit + 0xb4);
                iVar93 = *(int *)(local_7f0.hit + 0xb8);
                iVar94 = *(int *)(local_7f0.hit + 0xbc);
                bVar14 = (bool)((byte)(uVar104 >> 1) & 1);
                bVar15 = (bool)((byte)(uVar104 >> 2) & 1);
                bVar16 = (bool)((byte)(uVar104 >> 3) & 1);
                bVar17 = (bool)((byte)(uVar104 >> 4) & 1);
                bVar18 = (bool)((byte)(uVar104 >> 5) & 1);
                bVar19 = (bool)((byte)(uVar104 >> 6) & 1);
                bVar20 = (bool)((byte)(uVar104 >> 7) & 1);
                bVar21 = (bool)((byte)(uVar104 >> 9) & 1);
                bVar22 = (bool)((byte)(uVar104 >> 10) & 1);
                bVar23 = (bool)((byte)(uVar104 >> 0xb) & 1);
                bVar24 = (bool)((byte)(uVar104 >> 0xc) & 1);
                bVar30 = (bool)((byte)(uVar104 >> 0xd) & 1);
                bVar31 = (bool)((byte)(uVar104 >> 0xe) & 1);
                bVar38 = SUB81(uVar104 >> 0xf,0);
                *(uint *)(local_7f0.ray + 0x380) =
                     (uint)(bVar96 & 1) * *(int *)(local_7f0.hit + 0x80) |
                     (uint)!(bool)(bVar96 & 1) * *(int *)(local_7f0.ray + 0x380);
                *(uint *)(local_7f0.ray + 900) =
                     (uint)bVar14 * iVar105 | (uint)!bVar14 * *(int *)(local_7f0.ray + 900);
                *(uint *)(local_7f0.ray + 0x388) =
                     (uint)bVar15 * iVar141 | (uint)!bVar15 * *(int *)(local_7f0.ray + 0x388);
                *(uint *)(local_7f0.ray + 0x38c) =
                     (uint)bVar16 * iVar142 | (uint)!bVar16 * *(int *)(local_7f0.ray + 0x38c);
                *(uint *)(local_7f0.ray + 0x390) =
                     (uint)bVar17 * iVar143 | (uint)!bVar17 * *(int *)(local_7f0.ray + 0x390);
                *(uint *)(local_7f0.ray + 0x394) =
                     (uint)bVar18 * iVar144 | (uint)!bVar18 * *(int *)(local_7f0.ray + 0x394);
                *(uint *)(local_7f0.ray + 0x398) =
                     (uint)bVar19 * iVar145 | (uint)!bVar19 * *(int *)(local_7f0.ray + 0x398);
                *(uint *)(local_7f0.ray + 0x39c) =
                     (uint)bVar20 * iVar146 | (uint)!bVar20 * *(int *)(local_7f0.ray + 0x39c);
                *(uint *)(local_7f0.ray + 0x3a0) =
                     (uint)(bVar95 & 1) * iVar147 |
                     (uint)!(bool)(bVar95 & 1) * *(int *)(local_7f0.ray + 0x3a0);
                *(uint *)(local_7f0.ray + 0x3a4) =
                     (uint)bVar21 * iVar88 | (uint)!bVar21 * *(int *)(local_7f0.ray + 0x3a4);
                *(uint *)(local_7f0.ray + 0x3a8) =
                     (uint)bVar22 * iVar89 | (uint)!bVar22 * *(int *)(local_7f0.ray + 0x3a8);
                *(uint *)(local_7f0.ray + 0x3ac) =
                     (uint)bVar23 * iVar90 | (uint)!bVar23 * *(int *)(local_7f0.ray + 0x3ac);
                *(uint *)(local_7f0.ray + 0x3b0) =
                     (uint)bVar24 * iVar91 | (uint)!bVar24 * *(int *)(local_7f0.ray + 0x3b0);
                *(uint *)(local_7f0.ray + 0x3b4) =
                     (uint)bVar30 * iVar92 | (uint)!bVar30 * *(int *)(local_7f0.ray + 0x3b4);
                *(uint *)(local_7f0.ray + 0x3b8) =
                     (uint)bVar31 * iVar93 | (uint)!bVar31 * *(int *)(local_7f0.ray + 0x3b8);
                *(uint *)(local_7f0.ray + 0x3bc) =
                     (uint)bVar38 * iVar94 | (uint)!bVar38 * *(int *)(local_7f0.ray + 0x3bc);
                iVar105 = *(int *)(local_7f0.hit + 0xc4);
                iVar141 = *(int *)(local_7f0.hit + 200);
                iVar142 = *(int *)(local_7f0.hit + 0xcc);
                iVar143 = *(int *)(local_7f0.hit + 0xd0);
                iVar144 = *(int *)(local_7f0.hit + 0xd4);
                iVar145 = *(int *)(local_7f0.hit + 0xd8);
                iVar146 = *(int *)(local_7f0.hit + 0xdc);
                iVar147 = *(int *)(local_7f0.hit + 0xe0);
                iVar88 = *(int *)(local_7f0.hit + 0xe4);
                iVar89 = *(int *)(local_7f0.hit + 0xe8);
                iVar90 = *(int *)(local_7f0.hit + 0xec);
                iVar91 = *(int *)(local_7f0.hit + 0xf0);
                iVar92 = *(int *)(local_7f0.hit + 0xf4);
                iVar93 = *(int *)(local_7f0.hit + 0xf8);
                iVar94 = *(int *)(local_7f0.hit + 0xfc);
                bVar14 = (bool)((byte)(uVar104 >> 1) & 1);
                bVar15 = (bool)((byte)(uVar104 >> 2) & 1);
                bVar16 = (bool)((byte)(uVar104 >> 3) & 1);
                bVar17 = (bool)((byte)(uVar104 >> 4) & 1);
                bVar18 = (bool)((byte)(uVar104 >> 5) & 1);
                bVar19 = (bool)((byte)(uVar104 >> 6) & 1);
                bVar20 = (bool)((byte)(uVar104 >> 7) & 1);
                bVar21 = (bool)((byte)(uVar104 >> 9) & 1);
                bVar22 = (bool)((byte)(uVar104 >> 10) & 1);
                bVar23 = (bool)((byte)(uVar104 >> 0xb) & 1);
                bVar24 = (bool)((byte)(uVar104 >> 0xc) & 1);
                bVar30 = (bool)((byte)(uVar104 >> 0xd) & 1);
                bVar31 = (bool)((byte)(uVar104 >> 0xe) & 1);
                bVar38 = SUB81(uVar104 >> 0xf,0);
                *(uint *)(local_7f0.ray + 0x3c0) =
                     (uint)(bVar96 & 1) * *(int *)(local_7f0.hit + 0xc0) |
                     (uint)!(bool)(bVar96 & 1) * *(int *)(local_7f0.ray + 0x3c0);
                *(uint *)(local_7f0.ray + 0x3c4) =
                     (uint)bVar14 * iVar105 | (uint)!bVar14 * *(int *)(local_7f0.ray + 0x3c4);
                *(uint *)(local_7f0.ray + 0x3c8) =
                     (uint)bVar15 * iVar141 | (uint)!bVar15 * *(int *)(local_7f0.ray + 0x3c8);
                *(uint *)(local_7f0.ray + 0x3cc) =
                     (uint)bVar16 * iVar142 | (uint)!bVar16 * *(int *)(local_7f0.ray + 0x3cc);
                *(uint *)(local_7f0.ray + 0x3d0) =
                     (uint)bVar17 * iVar143 | (uint)!bVar17 * *(int *)(local_7f0.ray + 0x3d0);
                *(uint *)(local_7f0.ray + 0x3d4) =
                     (uint)bVar18 * iVar144 | (uint)!bVar18 * *(int *)(local_7f0.ray + 0x3d4);
                *(uint *)(local_7f0.ray + 0x3d8) =
                     (uint)bVar19 * iVar145 | (uint)!bVar19 * *(int *)(local_7f0.ray + 0x3d8);
                *(uint *)(local_7f0.ray + 0x3dc) =
                     (uint)bVar20 * iVar146 | (uint)!bVar20 * *(int *)(local_7f0.ray + 0x3dc);
                *(uint *)(local_7f0.ray + 0x3e0) =
                     (uint)(bVar95 & 1) * iVar147 |
                     (uint)!(bool)(bVar95 & 1) * *(int *)(local_7f0.ray + 0x3e0);
                *(uint *)(local_7f0.ray + 0x3e4) =
                     (uint)bVar21 * iVar88 | (uint)!bVar21 * *(int *)(local_7f0.ray + 0x3e4);
                *(uint *)(local_7f0.ray + 1000) =
                     (uint)bVar22 * iVar89 | (uint)!bVar22 * *(int *)(local_7f0.ray + 1000);
                *(uint *)(local_7f0.ray + 0x3ec) =
                     (uint)bVar23 * iVar90 | (uint)!bVar23 * *(int *)(local_7f0.ray + 0x3ec);
                *(uint *)(local_7f0.ray + 0x3f0) =
                     (uint)bVar24 * iVar91 | (uint)!bVar24 * *(int *)(local_7f0.ray + 0x3f0);
                *(uint *)(local_7f0.ray + 0x3f4) =
                     (uint)bVar30 * iVar92 | (uint)!bVar30 * *(int *)(local_7f0.ray + 0x3f4);
                *(uint *)(local_7f0.ray + 0x3f8) =
                     (uint)bVar31 * iVar93 | (uint)!bVar31 * *(int *)(local_7f0.ray + 0x3f8);
                *(uint *)(local_7f0.ray + 0x3fc) =
                     (uint)bVar38 * iVar94 | (uint)!bVar38 * *(int *)(local_7f0.ray + 0x3fc);
                iVar105 = *(int *)(local_7f0.hit + 0x104);
                iVar141 = *(int *)(local_7f0.hit + 0x108);
                iVar142 = *(int *)(local_7f0.hit + 0x10c);
                iVar143 = *(int *)(local_7f0.hit + 0x110);
                iVar144 = *(int *)(local_7f0.hit + 0x114);
                iVar145 = *(int *)(local_7f0.hit + 0x118);
                iVar146 = *(int *)(local_7f0.hit + 0x11c);
                iVar147 = *(int *)(local_7f0.hit + 0x120);
                iVar88 = *(int *)(local_7f0.hit + 0x124);
                iVar89 = *(int *)(local_7f0.hit + 0x128);
                iVar90 = *(int *)(local_7f0.hit + 300);
                iVar91 = *(int *)(local_7f0.hit + 0x130);
                iVar92 = *(int *)(local_7f0.hit + 0x134);
                iVar93 = *(int *)(local_7f0.hit + 0x138);
                iVar94 = *(int *)(local_7f0.hit + 0x13c);
                bVar14 = (bool)((byte)(uVar104 >> 1) & 1);
                bVar15 = (bool)((byte)(uVar104 >> 2) & 1);
                bVar16 = (bool)((byte)(uVar104 >> 3) & 1);
                bVar17 = (bool)((byte)(uVar104 >> 4) & 1);
                bVar18 = (bool)((byte)(uVar104 >> 5) & 1);
                bVar19 = (bool)((byte)(uVar104 >> 6) & 1);
                bVar20 = (bool)((byte)(uVar104 >> 7) & 1);
                bVar21 = (bool)((byte)(uVar104 >> 9) & 1);
                bVar22 = (bool)((byte)(uVar104 >> 10) & 1);
                bVar23 = (bool)((byte)(uVar104 >> 0xb) & 1);
                bVar24 = (bool)((byte)(uVar104 >> 0xc) & 1);
                bVar30 = (bool)((byte)(uVar104 >> 0xd) & 1);
                bVar31 = (bool)((byte)(uVar104 >> 0xe) & 1);
                bVar38 = SUB81(uVar104 >> 0xf,0);
                *(uint *)(local_7f0.ray + 0x400) =
                     (uint)(bVar96 & 1) * *(int *)(local_7f0.hit + 0x100) |
                     (uint)!(bool)(bVar96 & 1) * *(int *)(local_7f0.ray + 0x400);
                *(uint *)(local_7f0.ray + 0x404) =
                     (uint)bVar14 * iVar105 | (uint)!bVar14 * *(int *)(local_7f0.ray + 0x404);
                *(uint *)(local_7f0.ray + 0x408) =
                     (uint)bVar15 * iVar141 | (uint)!bVar15 * *(int *)(local_7f0.ray + 0x408);
                *(uint *)(local_7f0.ray + 0x40c) =
                     (uint)bVar16 * iVar142 | (uint)!bVar16 * *(int *)(local_7f0.ray + 0x40c);
                *(uint *)(local_7f0.ray + 0x410) =
                     (uint)bVar17 * iVar143 | (uint)!bVar17 * *(int *)(local_7f0.ray + 0x410);
                *(uint *)(local_7f0.ray + 0x414) =
                     (uint)bVar18 * iVar144 | (uint)!bVar18 * *(int *)(local_7f0.ray + 0x414);
                *(uint *)(local_7f0.ray + 0x418) =
                     (uint)bVar19 * iVar145 | (uint)!bVar19 * *(int *)(local_7f0.ray + 0x418);
                *(uint *)(local_7f0.ray + 0x41c) =
                     (uint)bVar20 * iVar146 | (uint)!bVar20 * *(int *)(local_7f0.ray + 0x41c);
                *(uint *)(local_7f0.ray + 0x420) =
                     (uint)(bVar95 & 1) * iVar147 |
                     (uint)!(bool)(bVar95 & 1) * *(int *)(local_7f0.ray + 0x420);
                *(uint *)(local_7f0.ray + 0x424) =
                     (uint)bVar21 * iVar88 | (uint)!bVar21 * *(int *)(local_7f0.ray + 0x424);
                *(uint *)(local_7f0.ray + 0x428) =
                     (uint)bVar22 * iVar89 | (uint)!bVar22 * *(int *)(local_7f0.ray + 0x428);
                *(uint *)(local_7f0.ray + 0x42c) =
                     (uint)bVar23 * iVar90 | (uint)!bVar23 * *(int *)(local_7f0.ray + 0x42c);
                *(uint *)(local_7f0.ray + 0x430) =
                     (uint)bVar24 * iVar91 | (uint)!bVar24 * *(int *)(local_7f0.ray + 0x430);
                *(uint *)(local_7f0.ray + 0x434) =
                     (uint)bVar30 * iVar92 | (uint)!bVar30 * *(int *)(local_7f0.ray + 0x434);
                *(uint *)(local_7f0.ray + 0x438) =
                     (uint)bVar31 * iVar93 | (uint)!bVar31 * *(int *)(local_7f0.ray + 0x438);
                *(uint *)(local_7f0.ray + 0x43c) =
                     (uint)bVar38 * iVar94 | (uint)!bVar38 * *(int *)(local_7f0.ray + 0x43c);
                auVar195 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_7f0.hit + 0x140));
                auVar195 = vmovdqu32_avx512f(auVar195);
                *(undefined1 (*) [64])(local_7f0.ray + 0x440) = auVar195;
                auVar195 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_7f0.hit + 0x180));
                auVar195 = vmovdqu32_avx512f(auVar195);
                *(undefined1 (*) [64])(local_7f0.ray + 0x480) = auVar195;
                auVar195 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_7f0.hit + 0x1c0));
                auVar195 = vmovdqa32_avx512f(auVar195);
                *(undefined1 (*) [64])(local_7f0.ray + 0x4c0) = auVar195;
                auVar195 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_7f0.hit + 0x200));
                auVar139 = auVar195._0_32_;
                auVar195 = vmovdqa32_avx512f(auVar195);
                *(undefined1 (*) [64])(local_7f0.ray + 0x500) = auVar195;
              }
              uVar4 = *(undefined4 *)(ray + k * 4 + 0x200);
              auVar80._4_4_ = uVar4;
              auVar80._0_4_ = uVar4;
              auVar80._8_4_ = uVar4;
              auVar80._12_4_ = uVar4;
              auVar80._16_4_ = uVar4;
              auVar80._20_4_ = uVar4;
              auVar80._24_4_ = uVar4;
              auVar80._28_4_ = uVar4;
              uVar71 = vcmpps_avx512vl(auVar175._0_32_,auVar80,2);
              uVar101 = (uint)(byte)(~(byte)(1 << (uVar97 & 0x1f)) & (byte)uVar101) & (uint)uVar71;
              goto LAB_01cee8cd;
            }
            bVar14 = false;
          }
          if (!bVar14) {
            uVar104 = (ulong)(uVar99 << 2);
            uVar4 = *(undefined4 *)((long)local_780 + uVar104);
            uVar5 = *(undefined4 *)(local_760 + uVar104);
            *(undefined4 *)(ray + k * 4 + 0x200) = *(undefined4 *)(local_740 + uVar104);
            *(undefined4 *)(ray + k * 4 + 0x300) = *(undefined4 *)((long)local_720 + uVar104);
            *(undefined4 *)(ray + k * 4 + 0x340) = *(undefined4 *)((long)local_700 + uVar104);
            *(undefined4 *)(ray + k * 4 + 0x380) = *(undefined4 *)((long)local_6e0 + uVar104);
            *(undefined4 *)(ray + k * 4 + 0x3c0) = uVar4;
            *(undefined4 *)(ray + k * 4 + 0x400) = uVar5;
            *(undefined4 *)(ray + k * 4 + 0x440) =
                 *(undefined4 *)((long)&(line->primIDs).field_0 + uVar104);
            *(uint *)(ray + k * 4 + 0x480) = uVar98;
            *(uint *)(ray + k * 4 + 0x4c0) = context->user->instID[0];
            *(uint *)(ray + k * 4 + 0x500) = context->user->instPrimID[0];
            return;
          }
          bVar96 = (byte)uVar101;
          if (bVar96 == 0) {
            return;
          }
          auVar110 = vblendmps_avx512vl(auVar193._0_32_,auVar175._0_32_);
          auVar140._0_4_ =
               (uint)(bVar96 & 1) * auVar110._0_4_ | (uint)!(bool)(bVar96 & 1) * auVar139._0_4_;
          bVar14 = (bool)((byte)(uVar101 >> 1) & 1);
          auVar140._4_4_ = (uint)bVar14 * auVar110._4_4_ | (uint)!bVar14 * auVar139._4_4_;
          bVar14 = (bool)((byte)(uVar101 >> 2) & 1);
          auVar140._8_4_ = (uint)bVar14 * auVar110._8_4_ | (uint)!bVar14 * auVar139._8_4_;
          bVar14 = (bool)((byte)(uVar101 >> 3) & 1);
          auVar140._12_4_ = (uint)bVar14 * auVar110._12_4_ | (uint)!bVar14 * auVar139._12_4_;
          bVar14 = (bool)((byte)(uVar101 >> 4) & 1);
          auVar140._16_4_ = (uint)bVar14 * auVar110._16_4_ | (uint)!bVar14 * auVar139._16_4_;
          bVar14 = (bool)((byte)(uVar101 >> 5) & 1);
          auVar140._20_4_ = (uint)bVar14 * auVar110._20_4_ | (uint)!bVar14 * auVar139._20_4_;
          bVar14 = (bool)((byte)(uVar101 >> 6) & 1);
          auVar140._24_4_ = (uint)bVar14 * auVar110._24_4_ | (uint)!bVar14 * auVar139._24_4_;
          auVar140._28_4_ =
               (uVar101 >> 7) * auVar110._28_4_ | (uint)!SUB41(uVar101 >> 7,0) * auVar139._28_4_;
          auVar110 = vshufps_avx(auVar140,auVar140,0xb1);
          auVar110 = vminps_avx(auVar140,auVar110);
          auVar111 = vshufpd_avx(auVar110,auVar110,5);
          auVar110 = vminps_avx(auVar110,auVar111);
          auVar111 = vpermpd_avx2(auVar110,0x4e);
          auVar110 = vminps_avx(auVar110,auVar111);
          uVar71 = vcmpps_avx512vl(auVar140,auVar110,0);
          bVar96 = (byte)uVar71 & bVar96;
          uVar98 = uVar101;
          if (bVar96 != 0) {
            uVar98 = (uint)bVar96;
          }
          uVar97 = 0;
          for (; auVar139 = auVar140, (uVar98 & 1) == 0; uVar98 = uVar98 >> 1 | 0x80000000) {
            uVar97 = uVar97 + 1;
          }
        } while( true );
      }
    }
  }
  return;
}

Assistant:

static __forceinline void intersect(const Precalculations& pre, RayHitK<K>& ray, size_t k, RayQueryContext* context, const Primitive& line)
      {
        STAT3(normal.trav_prims,1,1,1);
        const LineSegments* geom = context->scene->get<LineSegments>(line.geomID());
        Vec4vf<M> v0,v1; 
        vbool<M> cL,cR;
        line.gather(v0,v1,cL,cR,geom);
        const vbool<M> valid = line.valid();
        ConeCurveIntersectorK<M,K>::intersect(valid,ray,k,context,geom,pre,v0,v1,cL,cR,Intersect1KEpilogM<M,K,filter>(ray,k,context,line.geomID(),line.primID()));
      }